

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [32];
  float fVar22;
  undefined1 auVar23 [32];
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [12];
  float fVar87;
  undefined1 auVar88 [32];
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  uint uVar92;
  ulong uVar93;
  long lVar94;
  long lVar95;
  undefined4 uVar96;
  undefined8 uVar97;
  float fVar113;
  undefined1 auVar98 [16];
  float fVar111;
  undefined1 auVar99 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar112;
  float fVar114;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar149 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar186;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar204;
  float fVar208;
  undefined1 auVar205 [16];
  undefined8 uVar209;
  undefined8 uVar210;
  undefined8 uVar211;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar217 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_8a0 [32];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined1 local_820 [16];
  Precalculations *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 (*local_748) [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_610;
  Primitive *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  RTCHitN local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 local_470 [16];
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  uint local_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar91 = (ulong)(byte)PVar12;
  lVar24 = uVar91 * 0x25;
  auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar163 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar166 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar135 = *(float *)(prim + lVar24 + 0x12);
  auVar163 = vsubps_avx(auVar163,*(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar98._0_4_ = fVar135 * auVar163._0_4_;
  auVar98._4_4_ = fVar135 * auVar163._4_4_;
  auVar98._8_4_ = fVar135 * auVar163._8_4_;
  auVar98._12_4_ = fVar135 * auVar163._12_4_;
  auVar136._0_4_ = fVar135 * auVar166._0_4_;
  auVar136._4_4_ = fVar135 * auVar166._4_4_;
  auVar136._8_4_ = fVar135 * auVar166._8_4_;
  auVar136._12_4_ = fVar135 * auVar166._12_4_;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar91 * 4 + 6);
  auVar120 = vpmovsxbd_avx2(auVar163);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar91 * 5 + 6);
  auVar181 = vpmovsxbd_avx2(auVar166);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar91 * 6 + 6);
  auVar106 = vpmovsxbd_avx2(auVar5);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 0xf + 6);
  auVar127 = vpmovsxbd_avx2(auVar6);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar149 = vpmovsxbd_avx2(auVar7);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar91 + 6);
  auVar23 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar91 * 0x1a + 6);
  auVar191 = vpmovsxbd_avx2(auVar9);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar91 * 0x1b + 6);
  auVar100 = vpmovsxbd_avx2(auVar10);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar91 * 0x1c + 6);
  auVar108 = vpmovsxbd_avx2(auVar11);
  auVar21 = vcvtdq2ps_avx(auVar100);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar213._4_4_ = auVar136._0_4_;
  auVar213._0_4_ = auVar136._0_4_;
  auVar213._8_4_ = auVar136._0_4_;
  auVar213._12_4_ = auVar136._0_4_;
  auVar213._16_4_ = auVar136._0_4_;
  auVar213._20_4_ = auVar136._0_4_;
  auVar213._24_4_ = auVar136._0_4_;
  auVar213._28_4_ = auVar136._0_4_;
  auVar163 = vmovshdup_avx(auVar136);
  uVar97 = auVar163._0_8_;
  auVar222._8_8_ = uVar97;
  auVar222._0_8_ = uVar97;
  auVar222._16_8_ = uVar97;
  auVar222._24_8_ = uVar97;
  auVar163 = vshufps_avx(auVar136,auVar136,0xaa);
  fVar135 = auVar163._0_4_;
  auVar179._0_4_ = fVar135 * auVar106._0_4_;
  fVar111 = auVar163._4_4_;
  auVar179._4_4_ = fVar111 * auVar106._4_4_;
  auVar179._8_4_ = fVar135 * auVar106._8_4_;
  auVar179._12_4_ = fVar111 * auVar106._12_4_;
  auVar179._16_4_ = fVar135 * auVar106._16_4_;
  auVar179._20_4_ = fVar111 * auVar106._20_4_;
  auVar179._28_36_ = in_ZMM10._28_36_;
  auVar179._24_4_ = fVar135 * auVar106._24_4_;
  auVar122._4_4_ = auVar23._4_4_ * fVar111;
  auVar122._0_4_ = auVar23._0_4_ * fVar135;
  auVar122._8_4_ = auVar23._8_4_ * fVar135;
  auVar122._12_4_ = auVar23._12_4_ * fVar111;
  auVar122._16_4_ = auVar23._16_4_ * fVar135;
  auVar122._20_4_ = auVar23._20_4_ * fVar111;
  auVar122._24_4_ = auVar23._24_4_ * fVar135;
  auVar122._28_4_ = auVar100._28_4_;
  auVar187._0_4_ = auVar108._0_4_ * fVar135;
  auVar187._4_4_ = auVar108._4_4_ * fVar111;
  auVar187._8_4_ = auVar108._8_4_ * fVar135;
  auVar187._12_4_ = auVar108._12_4_ * fVar111;
  auVar187._16_4_ = auVar108._16_4_ * fVar135;
  auVar187._20_4_ = auVar108._20_4_ * fVar111;
  auVar187._24_4_ = auVar108._24_4_ * fVar135;
  auVar187._28_4_ = 0;
  auVar163 = vfmadd231ps_fma(auVar179._0_32_,auVar222,auVar181);
  auVar166 = vfmadd231ps_fma(auVar122,auVar222,auVar149);
  auVar5 = vfmadd231ps_fma(auVar187,auVar21,auVar222);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar213,auVar120);
  auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar213,auVar127);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar191,auVar213);
  auVar214._4_4_ = auVar98._0_4_;
  auVar214._0_4_ = auVar98._0_4_;
  auVar214._8_4_ = auVar98._0_4_;
  auVar214._12_4_ = auVar98._0_4_;
  auVar214._16_4_ = auVar98._0_4_;
  auVar214._20_4_ = auVar98._0_4_;
  auVar214._24_4_ = auVar98._0_4_;
  auVar214._28_4_ = auVar98._0_4_;
  auVar163 = vmovshdup_avx(auVar98);
  uVar97 = auVar163._0_8_;
  auVar223._8_8_ = uVar97;
  auVar223._0_8_ = uVar97;
  auVar223._16_8_ = uVar97;
  auVar223._24_8_ = uVar97;
  auVar163 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar135 = auVar163._0_4_;
  auVar147._0_4_ = fVar135 * auVar106._0_4_;
  fVar111 = auVar163._4_4_;
  auVar147._4_4_ = fVar111 * auVar106._4_4_;
  auVar147._8_4_ = fVar135 * auVar106._8_4_;
  auVar147._12_4_ = fVar111 * auVar106._12_4_;
  auVar147._16_4_ = fVar135 * auVar106._16_4_;
  auVar147._20_4_ = fVar111 * auVar106._20_4_;
  auVar147._24_4_ = fVar135 * auVar106._24_4_;
  auVar147._28_4_ = 0;
  auVar100._4_4_ = auVar23._4_4_ * fVar111;
  auVar100._0_4_ = auVar23._0_4_ * fVar135;
  auVar100._8_4_ = auVar23._8_4_ * fVar135;
  auVar100._12_4_ = auVar23._12_4_ * fVar111;
  auVar100._16_4_ = auVar23._16_4_ * fVar135;
  auVar100._20_4_ = auVar23._20_4_ * fVar111;
  auVar100._24_4_ = auVar23._24_4_ * fVar135;
  auVar100._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar108._4_4_ * fVar111;
  auVar106._0_4_ = auVar108._0_4_ * fVar135;
  auVar106._8_4_ = auVar108._8_4_ * fVar135;
  auVar106._12_4_ = auVar108._12_4_ * fVar111;
  auVar106._16_4_ = auVar108._16_4_ * fVar135;
  auVar106._20_4_ = auVar108._20_4_ * fVar111;
  auVar106._24_4_ = auVar108._24_4_ * fVar135;
  auVar106._28_4_ = fVar111;
  auVar163 = vfmadd231ps_fma(auVar147,auVar223,auVar181);
  auVar7 = vfmadd231ps_fma(auVar100,auVar223,auVar149);
  auVar8 = vfmadd231ps_fma(auVar106,auVar223,auVar21);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar214,auVar120);
  local_1a0._8_4_ = 0x7fffffff;
  local_1a0._0_8_ = 0x7fffffff7fffffff;
  local_1a0._12_4_ = 0x7fffffff;
  local_1a0._16_4_ = 0x7fffffff;
  local_1a0._20_4_ = 0x7fffffff;
  local_1a0._24_4_ = 0x7fffffff;
  local_1a0._28_4_ = 0x7fffffff;
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar155._16_4_ = 0x219392ef;
  auVar155._20_4_ = 0x219392ef;
  auVar155._24_4_ = 0x219392ef;
  auVar155._28_4_ = 0x219392ef;
  auVar120 = vandps_avx(ZEXT1632(auVar6),local_1a0);
  auVar120 = vcmpps_avx(auVar120,auVar155,1);
  auVar181 = vblendvps_avx(ZEXT1632(auVar6),auVar155,auVar120);
  auVar120 = vandps_avx(ZEXT1632(auVar166),local_1a0);
  auVar120 = vcmpps_avx(auVar120,auVar155,1);
  auVar106 = vblendvps_avx(ZEXT1632(auVar166),auVar155,auVar120);
  auVar120 = vandps_avx(ZEXT1632(auVar5),local_1a0);
  auVar120 = vcmpps_avx(auVar120,auVar155,1);
  auVar120 = vblendvps_avx(ZEXT1632(auVar5),auVar155,auVar120);
  auVar136 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar214,auVar127);
  auVar127 = vrcpps_avx(auVar181);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar214,auVar191);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = 0x3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar188._16_4_ = 0x3f800000;
  auVar188._20_4_ = 0x3f800000;
  auVar188._24_4_ = 0x3f800000;
  auVar188._28_4_ = 0x3f800000;
  auVar163 = vfnmadd213ps_fma(auVar181,auVar127,auVar188);
  auVar163 = vfmadd132ps_fma(ZEXT1632(auVar163),auVar127,auVar127);
  auVar181 = vrcpps_avx(auVar106);
  auVar166 = vfnmadd213ps_fma(auVar106,auVar181,auVar188);
  auVar106 = vrcpps_avx(auVar120);
  auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar181,auVar181);
  auVar5 = vfnmadd213ps_fma(auVar120,auVar106,auVar188);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar106,auVar106);
  fVar135 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 7 + 6));
  auVar180._4_4_ = fVar135;
  auVar180._0_4_ = fVar135;
  auVar180._8_4_ = fVar135;
  auVar180._12_4_ = fVar135;
  auVar180._16_4_ = fVar135;
  auVar180._20_4_ = fVar135;
  auVar180._24_4_ = fVar135;
  auVar180._28_4_ = fVar135;
  auVar181 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0xb + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar120);
  auVar6 = vfmadd213ps_fma(auVar181,auVar180,auVar120);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 9 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar181 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0xd + 6));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar120);
  auVar7 = vfmadd213ps_fma(auVar181,auVar180,auVar120);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x12 + 6));
  uVar93 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar181 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 2 + uVar93 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar120);
  auVar8 = vfmadd213ps_fma(auVar181,auVar180,auVar120);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 + 6));
  auVar181 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x18 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar120);
  auVar9 = vfmadd213ps_fma(auVar181,auVar180,auVar120);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x1d + 6));
  auVar181 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar120);
  auVar10 = vfmadd213ps_fma(auVar181,auVar180,auVar120);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar91) + 6)
                           );
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar181 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x23 + 6));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar120);
  auVar11 = vfmadd213ps_fma(auVar181,auVar180,auVar120);
  auVar120 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar98));
  auVar127._4_4_ = auVar163._4_4_ * auVar120._4_4_;
  auVar127._0_4_ = auVar163._0_4_ * auVar120._0_4_;
  auVar127._8_4_ = auVar163._8_4_ * auVar120._8_4_;
  auVar127._12_4_ = auVar163._12_4_ * auVar120._12_4_;
  auVar127._16_4_ = auVar120._16_4_ * 0.0;
  auVar127._20_4_ = auVar120._20_4_ * 0.0;
  auVar127._24_4_ = auVar120._24_4_ * 0.0;
  auVar127._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar98));
  auVar149._4_4_ = auVar163._4_4_ * auVar120._4_4_;
  auVar149._0_4_ = auVar163._0_4_ * auVar120._0_4_;
  auVar149._8_4_ = auVar163._8_4_ * auVar120._8_4_;
  auVar149._12_4_ = auVar163._12_4_ * auVar120._12_4_;
  auVar149._16_4_ = auVar120._16_4_ * 0.0;
  auVar149._20_4_ = auVar120._20_4_ * 0.0;
  auVar149._24_4_ = auVar120._24_4_ * 0.0;
  auVar149._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar136));
  auVar23._4_4_ = auVar166._4_4_ * auVar120._4_4_;
  auVar23._0_4_ = auVar166._0_4_ * auVar120._0_4_;
  auVar23._8_4_ = auVar166._8_4_ * auVar120._8_4_;
  auVar23._12_4_ = auVar166._12_4_ * auVar120._12_4_;
  auVar23._16_4_ = auVar120._16_4_ * 0.0;
  auVar23._20_4_ = auVar120._20_4_ * 0.0;
  auVar23._24_4_ = auVar120._24_4_ * 0.0;
  auVar23._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar136));
  auVar191._4_4_ = auVar166._4_4_ * auVar120._4_4_;
  auVar191._0_4_ = auVar166._0_4_ * auVar120._0_4_;
  auVar191._8_4_ = auVar166._8_4_ * auVar120._8_4_;
  auVar191._12_4_ = auVar166._12_4_ * auVar120._12_4_;
  auVar191._16_4_ = auVar120._16_4_ * 0.0;
  auVar191._20_4_ = auVar120._20_4_ * 0.0;
  auVar191._24_4_ = auVar120._24_4_ * 0.0;
  auVar191._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar99));
  auVar21._4_4_ = auVar5._4_4_ * auVar120._4_4_;
  auVar21._0_4_ = auVar5._0_4_ * auVar120._0_4_;
  auVar21._8_4_ = auVar5._8_4_ * auVar120._8_4_;
  auVar21._12_4_ = auVar5._12_4_ * auVar120._12_4_;
  auVar21._16_4_ = auVar120._16_4_ * 0.0;
  auVar21._20_4_ = auVar120._20_4_ * 0.0;
  auVar21._24_4_ = auVar120._24_4_ * 0.0;
  auVar21._28_4_ = auVar120._28_4_;
  auVar120 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar99));
  auVar108._4_4_ = auVar5._4_4_ * auVar120._4_4_;
  auVar108._0_4_ = auVar5._0_4_ * auVar120._0_4_;
  auVar108._8_4_ = auVar5._8_4_ * auVar120._8_4_;
  auVar108._12_4_ = auVar5._12_4_ * auVar120._12_4_;
  auVar108._16_4_ = auVar120._16_4_ * 0.0;
  auVar108._20_4_ = auVar120._20_4_ * 0.0;
  auVar108._24_4_ = auVar120._24_4_ * 0.0;
  auVar108._28_4_ = auVar120._28_4_;
  auVar120 = vpminsd_avx2(auVar127,auVar149);
  auVar181 = vpminsd_avx2(auVar23,auVar191);
  auVar120 = vmaxps_avx(auVar120,auVar181);
  auVar181 = vpminsd_avx2(auVar21,auVar108);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar189._4_4_ = uVar96;
  auVar189._0_4_ = uVar96;
  auVar189._8_4_ = uVar96;
  auVar189._12_4_ = uVar96;
  auVar189._16_4_ = uVar96;
  auVar189._20_4_ = uVar96;
  auVar189._24_4_ = uVar96;
  auVar189._28_4_ = uVar96;
  auVar181 = vmaxps_avx(auVar181,auVar189);
  auVar120 = vmaxps_avx(auVar120,auVar181);
  local_80._4_4_ = auVar120._4_4_ * 0.99999964;
  local_80._0_4_ = auVar120._0_4_ * 0.99999964;
  local_80._8_4_ = auVar120._8_4_ * 0.99999964;
  local_80._12_4_ = auVar120._12_4_ * 0.99999964;
  local_80._16_4_ = auVar120._16_4_ * 0.99999964;
  local_80._20_4_ = auVar120._20_4_ * 0.99999964;
  local_80._24_4_ = auVar120._24_4_ * 0.99999964;
  local_80._28_4_ = auVar120._28_4_;
  auVar120 = vpmaxsd_avx2(auVar127,auVar149);
  auVar181 = vpmaxsd_avx2(auVar23,auVar191);
  auVar120 = vminps_avx(auVar120,auVar181);
  auVar181 = vpmaxsd_avx2(auVar21,auVar108);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar148._4_4_ = uVar96;
  auVar148._0_4_ = uVar96;
  auVar148._8_4_ = uVar96;
  auVar148._12_4_ = uVar96;
  auVar148._16_4_ = uVar96;
  auVar148._20_4_ = uVar96;
  auVar148._24_4_ = uVar96;
  auVar148._28_4_ = uVar96;
  auVar181 = vminps_avx(auVar181,auVar148);
  auVar120 = vminps_avx(auVar120,auVar181);
  auVar224._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar224._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar224._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar224._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar224._16_4_ = auVar120._16_4_ * 1.0000004;
  auVar224._20_4_ = auVar120._20_4_ * 1.0000004;
  auVar224._24_4_ = auVar120._24_4_ * 1.0000004;
  auVar224._28_4_ = auVar120._28_4_;
  auVar120._1_3_ = 0;
  auVar120[0] = PVar12;
  auVar120[4] = PVar12;
  auVar120._5_3_ = 0;
  auVar120[8] = PVar12;
  auVar120._9_3_ = 0;
  auVar120[0xc] = PVar12;
  auVar120._13_3_ = 0;
  auVar120[0x10] = PVar12;
  auVar120._17_3_ = 0;
  auVar120[0x14] = PVar12;
  auVar120._21_3_ = 0;
  auVar120[0x18] = PVar12;
  auVar120._25_3_ = 0;
  auVar120[0x1c] = PVar12;
  auVar120._29_3_ = 0;
  auVar181 = vpcmpgtd_avx2(auVar120,_DAT_01fe9900);
  auVar120 = vcmpps_avx(local_80,auVar224,2);
  auVar120 = vandps_avx(auVar120,auVar181);
  uVar89 = vmovmskps_avx(auVar120);
  if (uVar89 != 0) {
    uVar89 = uVar89 & 0xff;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    local_610 = pre->ray_space + k;
    local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_2f0 = 0x7fffffff;
    uStack_2ec = 0x7fffffff;
    uStack_2e8 = 0x7fffffff;
    uStack_2e4 = 0x7fffffff;
    local_808 = pre;
    local_608 = prim;
    do {
      auVar120 = local_580;
      lVar24 = 0;
      for (uVar91 = (ulong)uVar89; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar13 = *(uint *)(local_608 + 2);
      uVar14 = *(uint *)(local_608 + lVar24 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[uVar13].ptr;
      uVar91 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                               (ulong)uVar14 *
                               pGVar17[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar135 = (pGVar17->time_range).lower;
      fVar135 = pGVar17->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar135) /
                ((pGVar17->time_range).upper - fVar135));
      auVar163 = vroundss_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),9);
      auVar163 = vminss_avx(auVar163,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
      auVar163 = vmaxss_avx(ZEXT816(0) << 0x20,auVar163);
      fVar135 = fVar135 - auVar163._0_4_;
      _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar95 = (long)(int)auVar163._0_4_ * 0x38;
      lVar24 = *(long *)(_Var18 + 0x10 + lVar95);
      lVar94 = *(long *)(_Var18 + 0x38 + lVar95);
      lVar19 = *(long *)(_Var18 + 0x48 + lVar95);
      pfVar1 = (float *)(lVar94 + uVar91 * lVar19);
      auVar160._0_4_ = fVar135 * *pfVar1;
      auVar160._4_4_ = fVar135 * pfVar1[1];
      auVar160._8_4_ = fVar135 * pfVar1[2];
      auVar160._12_4_ = fVar135 * pfVar1[3];
      pfVar1 = (float *)(lVar94 + (uVar91 + 1) * lVar19);
      auVar200._0_4_ = fVar135 * *pfVar1;
      auVar200._4_4_ = fVar135 * pfVar1[1];
      auVar200._8_4_ = fVar135 * pfVar1[2];
      auVar200._12_4_ = fVar135 * pfVar1[3];
      pfVar1 = (float *)(lVar94 + (uVar91 + 2) * lVar19);
      auVar137._0_4_ = fVar135 * *pfVar1;
      auVar137._4_4_ = fVar135 * pfVar1[1];
      auVar137._8_4_ = fVar135 * pfVar1[2];
      auVar137._12_4_ = fVar135 * pfVar1[3];
      pfVar1 = (float *)(lVar94 + lVar19 * (uVar91 + 3));
      auVar153._0_4_ = fVar135 * *pfVar1;
      auVar153._4_4_ = fVar135 * pfVar1[1];
      auVar153._8_4_ = fVar135 * pfVar1[2];
      auVar153._12_4_ = fVar135 * pfVar1[3];
      lVar94 = *(long *)(_Var18 + lVar95);
      fVar135 = 1.0 - fVar135;
      auVar99._4_4_ = fVar135;
      auVar99._0_4_ = fVar135;
      auVar99._8_4_ = fVar135;
      auVar99._12_4_ = fVar135;
      auVar8 = vfmadd231ps_fma(auVar160,auVar99,*(undefined1 (*) [16])(lVar94 + lVar24 * uVar91));
      auVar9 = vfmadd231ps_fma(auVar200,auVar99,
                               *(undefined1 (*) [16])(lVar94 + lVar24 * (uVar91 + 1)));
      auVar10 = vfmadd231ps_fma(auVar137,auVar99,
                                *(undefined1 (*) [16])(lVar94 + lVar24 * (uVar91 + 2)));
      auVar11 = vfmadd231ps_fma(auVar153,auVar99,
                                *(undefined1 (*) [16])(lVar94 + lVar24 * (uVar91 + 3)));
      iVar15 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar24 = (long)iVar15 * 0x44;
      auVar163 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar6 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar166 = vsubps_avx(auVar8,auVar6);
      uVar96 = auVar166._0_4_;
      auVar138._4_4_ = uVar96;
      auVar138._0_4_ = uVar96;
      auVar138._8_4_ = uVar96;
      auVar138._12_4_ = uVar96;
      auVar163 = vshufps_avx(auVar166,auVar166,0x55);
      auVar166 = vshufps_avx(auVar166,auVar166,0xaa);
      aVar3 = (local_610->vx).field_0;
      aVar4 = (local_610->vy).field_0;
      fVar135 = (local_610->vz).field_0.m128[0];
      fVar111 = (local_610->vz).field_0.m128[1];
      fVar112 = (local_610->vz).field_0.m128[2];
      fVar22 = (local_610->vz).field_0.m128[3];
      auVar212._0_4_ = fVar135 * auVar166._0_4_;
      auVar212._4_4_ = fVar111 * auVar166._4_4_;
      auVar212._8_4_ = fVar112 * auVar166._8_4_;
      auVar212._12_4_ = fVar22 * auVar166._12_4_;
      auVar163 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar4,auVar163);
      auVar98 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar3,auVar138);
      auVar163 = vblendps_avx(auVar98,auVar8,8);
      auVar5 = vsubps_avx(auVar9,auVar6);
      uVar96 = auVar5._0_4_;
      auVar154._4_4_ = uVar96;
      auVar154._0_4_ = uVar96;
      auVar154._8_4_ = uVar96;
      auVar154._12_4_ = uVar96;
      auVar166 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar196._0_4_ = fVar135 * auVar5._0_4_;
      auVar196._4_4_ = fVar111 * auVar5._4_4_;
      auVar196._8_4_ = fVar112 * auVar5._8_4_;
      auVar196._12_4_ = fVar22 * auVar5._12_4_;
      auVar166 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar4,auVar166);
      auVar136 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar3,auVar154);
      auVar166 = vblendps_avx(auVar136,auVar9,8);
      auVar7 = vsubps_avx(auVar10,auVar6);
      uVar96 = auVar7._0_4_;
      auVar183._4_4_ = uVar96;
      auVar183._0_4_ = uVar96;
      auVar183._8_4_ = uVar96;
      auVar183._12_4_ = uVar96;
      auVar5 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar201._0_4_ = fVar135 * auVar7._0_4_;
      auVar201._4_4_ = fVar111 * auVar7._4_4_;
      auVar201._8_4_ = fVar112 * auVar7._8_4_;
      auVar201._12_4_ = fVar22 * auVar7._12_4_;
      auVar5 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar4,auVar5);
      auVar99 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar3,auVar183);
      auVar5 = vblendps_avx(auVar99,auVar10,8);
      auVar7 = vsubps_avx(auVar11,auVar6);
      uVar96 = auVar7._0_4_;
      auVar184._4_4_ = uVar96;
      auVar184._0_4_ = uVar96;
      auVar184._8_4_ = uVar96;
      auVar184._12_4_ = uVar96;
      auVar6 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar205._0_4_ = fVar135 * auVar7._0_4_;
      auVar205._4_4_ = fVar111 * auVar7._4_4_;
      auVar205._8_4_ = fVar112 * auVar7._8_4_;
      auVar205._12_4_ = fVar22 * auVar7._12_4_;
      auVar6 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar4,auVar6);
      auVar137 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar3,auVar184);
      auVar6 = vblendps_avx(auVar137,auVar11,8);
      auVar25._4_4_ = uStack_2ec;
      auVar25._0_4_ = local_2f0;
      auVar25._8_4_ = uStack_2e8;
      auVar25._12_4_ = uStack_2e4;
      auVar163 = vandps_avx(auVar163,auVar25);
      auVar166 = vandps_avx(auVar166,auVar25);
      auVar7 = vmaxps_avx(auVar163,auVar166);
      auVar163 = vandps_avx(auVar5,auVar25);
      auVar166 = vandps_avx(auVar6,auVar25);
      auVar163 = vmaxps_avx(auVar163,auVar166);
      auVar163 = vmaxps_avx(auVar7,auVar163);
      auVar166 = vmovshdup_avx(auVar163);
      auVar166 = vmaxss_avx(auVar166,auVar163);
      auVar163 = vshufpd_avx(auVar163,auVar163,1);
      auVar163 = vmaxss_avx(auVar163,auVar166);
      auVar166 = vmovshdup_avx(auVar98);
      uVar97 = auVar166._0_8_;
      local_540._8_8_ = uVar97;
      local_540._0_8_ = uVar97;
      local_540._16_8_ = uVar97;
      local_540._24_8_ = uVar97;
      auVar166 = vmovshdup_avx(auVar136);
      uVar97 = auVar166._0_8_;
      local_560._8_8_ = uVar97;
      local_560._0_8_ = uVar97;
      local_560._16_8_ = uVar97;
      local_560._24_8_ = uVar97;
      auVar181 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      uVar96 = auVar99._0_4_;
      local_740._4_4_ = uVar96;
      local_740._0_4_ = uVar96;
      local_740._8_4_ = uVar96;
      local_740._12_4_ = uVar96;
      local_740._16_4_ = uVar96;
      local_740._20_4_ = uVar96;
      local_740._24_4_ = uVar96;
      local_740._28_4_ = uVar96;
      auVar166 = vmovshdup_avx(auVar99);
      uVar97 = auVar166._0_8_;
      local_660._8_8_ = uVar97;
      local_660._0_8_ = uVar97;
      local_660._16_8_ = uVar97;
      local_660._24_8_ = uVar97;
      local_3a0 = *(float *)(bspline_basis0 + lVar24 + 0xd8c);
      fStack_39c = *(float *)(bspline_basis0 + lVar24 + 0xd90);
      fStack_398 = *(float *)(bspline_basis0 + lVar24 + 0xd94);
      fStack_394 = *(float *)(bspline_basis0 + lVar24 + 0xd98);
      fStack_390 = *(float *)(bspline_basis0 + lVar24 + 0xd9c);
      fStack_38c = *(float *)(bspline_basis0 + lVar24 + 0xda0);
      fStack_388 = *(float *)(bspline_basis0 + lVar24 + 0xda4);
      auVar166 = vmovshdup_avx(auVar137);
      local_500 = auVar166._0_8_;
      local_520 = auVar137._0_4_;
      auVar121._0_4_ = local_3a0 * local_520;
      auVar121._4_4_ = fStack_39c * local_520;
      auVar121._8_4_ = fStack_398 * local_520;
      auVar121._12_4_ = fStack_394 * local_520;
      auVar121._16_4_ = fStack_390 * local_520;
      auVar121._20_4_ = fStack_38c * local_520;
      auVar121._24_4_ = fStack_388 * local_520;
      auVar121._28_4_ = 0;
      auVar5 = vfmadd231ps_fma(auVar121,auVar181,local_740);
      fVar135 = auVar166._0_4_;
      auVar173._0_4_ = local_3a0 * fVar135;
      fVar112 = auVar166._4_4_;
      auVar173._4_4_ = fStack_39c * fVar112;
      auVar173._8_4_ = fStack_398 * fVar135;
      auVar173._12_4_ = fStack_394 * fVar112;
      auVar173._16_4_ = fStack_390 * fVar135;
      auVar173._20_4_ = fStack_38c * fVar112;
      auVar173._24_4_ = fStack_388 * fVar135;
      auVar173._28_4_ = 0;
      auVar166 = vfmadd231ps_fma(auVar173,auVar181,local_660);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      uVar96 = auVar136._0_4_;
      local_720._4_4_ = uVar96;
      local_720._0_4_ = uVar96;
      local_720._8_4_ = uVar96;
      local_720._12_4_ = uVar96;
      local_720._16_4_ = uVar96;
      local_720._20_4_ = uVar96;
      local_720._24_4_ = uVar96;
      local_720._28_4_ = uVar96;
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar106,local_720);
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar106,local_560);
      auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      uVar96 = auVar98._0_4_;
      local_7e0._4_4_ = uVar96;
      local_7e0._0_4_ = uVar96;
      local_7e0._8_4_ = uVar96;
      local_7e0._12_4_ = uVar96;
      local_7e0._16_4_ = uVar96;
      local_7e0._20_4_ = uVar96;
      local_7e0._24_4_ = uVar96;
      local_7e0._28_4_ = uVar96;
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,local_7e0);
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar127,local_540);
      auVar149 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      fVar113 = *(float *)(bspline_basis1 + lVar24 + 0xd8c);
      fVar114 = *(float *)(bspline_basis1 + lVar24 + 0xd90);
      fVar115 = *(float *)(bspline_basis1 + lVar24 + 0xd94);
      fVar116 = *(float *)(bspline_basis1 + lVar24 + 0xd98);
      fVar117 = *(float *)(bspline_basis1 + lVar24 + 0xd9c);
      fVar186 = *(float *)(bspline_basis1 + lVar24 + 0xda0);
      fVar87 = *(float *)(bspline_basis1 + lVar24 + 0xda4);
      auVar26._4_4_ = fVar114 * local_520;
      auVar26._0_4_ = fVar113 * local_520;
      auVar26._8_4_ = fVar115 * local_520;
      auVar26._12_4_ = fVar116 * local_520;
      auVar26._16_4_ = fVar117 * local_520;
      auVar26._20_4_ = fVar186 * local_520;
      auVar26._24_4_ = fVar87 * local_520;
      auVar26._28_4_ = local_520;
      auVar6 = vfmadd231ps_fma(auVar26,auVar149,local_740);
      auVar27._4_4_ = fVar114 * fVar112;
      auVar27._0_4_ = fVar113 * fVar135;
      auVar27._8_4_ = fVar115 * fVar135;
      auVar27._12_4_ = fVar116 * fVar112;
      auVar27._16_4_ = fVar117 * fVar135;
      auVar27._20_4_ = fVar186 * fVar112;
      auVar27._24_4_ = fVar87 * fVar135;
      auVar27._28_4_ = fVar112;
      auVar7 = vfmadd231ps_fma(auVar27,auVar149,local_660);
      auVar23 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar23,local_720);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar23,local_560);
      auVar191 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar191,local_7e0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar191,local_540);
      auVar100 = ZEXT1632(auVar6);
      auVar122 = ZEXT1632(auVar5);
      local_3c0 = vsubps_avx(auVar100,auVar122);
      local_340 = ZEXT1632(auVar7);
      local_360 = ZEXT1632(auVar166);
      local_380 = vsubps_avx(local_340,local_360);
      auVar101._0_4_ = auVar166._0_4_ * local_3c0._0_4_;
      auVar101._4_4_ = auVar166._4_4_ * local_3c0._4_4_;
      auVar101._8_4_ = auVar166._8_4_ * local_3c0._8_4_;
      auVar101._12_4_ = auVar166._12_4_ * local_3c0._12_4_;
      auVar101._16_4_ = local_3c0._16_4_ * 0.0;
      auVar101._20_4_ = local_3c0._20_4_ * 0.0;
      auVar101._24_4_ = local_3c0._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      auVar179 = ZEXT3264(auVar181);
      fVar216 = local_380._0_4_;
      auVar123._0_4_ = fVar216 * auVar5._0_4_;
      fVar218 = local_380._4_4_;
      auVar123._4_4_ = fVar218 * auVar5._4_4_;
      fVar219 = local_380._8_4_;
      auVar123._8_4_ = fVar219 * auVar5._8_4_;
      fVar204 = local_380._12_4_;
      auVar123._12_4_ = fVar204 * auVar5._12_4_;
      fVar208 = local_380._16_4_;
      auVar123._16_4_ = fVar208 * 0.0;
      fVar220 = local_380._20_4_;
      auVar123._20_4_ = fVar220 * 0.0;
      fVar221 = local_380._24_4_;
      auVar123._24_4_ = fVar221 * 0.0;
      auVar123._28_4_ = 0;
      auVar108 = vsubps_avx(auVar101,auVar123);
      auVar166 = vpermilps_avx(auVar8,0xff);
      uVar97 = auVar166._0_8_;
      local_a0._8_8_ = uVar97;
      local_a0._0_8_ = uVar97;
      local_a0._16_8_ = uVar97;
      local_a0._24_8_ = uVar97;
      auVar5 = vpermilps_avx(auVar9,0xff);
      uVar97 = auVar5._0_8_;
      local_c0._8_8_ = uVar97;
      local_c0._0_8_ = uVar97;
      local_c0._16_8_ = uVar97;
      local_c0._24_8_ = uVar97;
      auVar5 = vpermilps_avx(auVar10,0xff);
      uVar97 = auVar5._0_8_;
      local_e0._8_8_ = uVar97;
      local_e0._0_8_ = uVar97;
      local_e0._16_8_ = uVar97;
      local_e0._24_8_ = uVar97;
      auVar5 = vpermilps_avx(auVar11,0xff);
      local_100 = auVar5._0_8_;
      fStack_384 = (float)*(undefined4 *)(bspline_basis0 + lVar24 + 0xda8);
      fVar111 = auVar5._0_4_;
      fVar22 = auVar5._4_4_;
      auVar28._4_4_ = fStack_39c * fVar22;
      auVar28._0_4_ = local_3a0 * fVar111;
      auVar28._8_4_ = fStack_398 * fVar111;
      auVar28._12_4_ = fStack_394 * fVar22;
      auVar28._16_4_ = fStack_390 * fVar111;
      auVar28._20_4_ = fStack_38c * fVar22;
      auVar28._24_4_ = fStack_388 * fVar111;
      auVar28._28_4_ = *(undefined4 *)(bspline_basis0 + lVar24 + 0xda8);
      auVar5 = vfmadd231ps_fma(auVar28,auVar181,local_e0);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar106,local_c0);
      auVar194 = ZEXT3264(auVar149);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar29._4_4_ = fVar114 * fVar22;
      auVar29._0_4_ = fVar113 * fVar111;
      auVar29._8_4_ = fVar115 * fVar111;
      auVar29._12_4_ = fVar116 * fVar22;
      auVar29._16_4_ = fVar117 * fVar111;
      auVar29._20_4_ = fVar186 * fVar22;
      auVar29._24_4_ = fVar87 * fVar111;
      auVar29._28_4_ = fVar22;
      auVar6 = vfmadd231ps_fma(auVar29,auVar149,local_e0);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar23,local_c0);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar191,local_a0);
      auVar30._4_4_ = fVar218 * fVar218;
      auVar30._0_4_ = fVar216 * fVar216;
      auVar30._8_4_ = fVar219 * fVar219;
      auVar30._12_4_ = fVar204 * fVar204;
      auVar30._16_4_ = fVar208 * fVar208;
      auVar30._20_4_ = fVar220 * fVar220;
      auVar30._24_4_ = fVar221 * fVar221;
      auVar30._28_4_ = auVar166._4_4_;
      auVar166 = vfmadd231ps_fma(auVar30,local_3c0,local_3c0);
      auVar224 = ZEXT1632(auVar5);
      auVar21 = vmaxps_avx(auVar224,ZEXT1632(auVar6));
      auVar31._4_4_ = auVar21._4_4_ * auVar21._4_4_ * auVar166._4_4_;
      auVar31._0_4_ = auVar21._0_4_ * auVar21._0_4_ * auVar166._0_4_;
      auVar31._8_4_ = auVar21._8_4_ * auVar21._8_4_ * auVar166._8_4_;
      auVar31._12_4_ = auVar21._12_4_ * auVar21._12_4_ * auVar166._12_4_;
      auVar31._16_4_ = auVar21._16_4_ * auVar21._16_4_ * 0.0;
      auVar31._20_4_ = auVar21._20_4_ * auVar21._20_4_ * 0.0;
      auVar31._24_4_ = auVar21._24_4_ * auVar21._24_4_ * 0.0;
      auVar31._28_4_ = auVar21._28_4_;
      auVar32._4_4_ = auVar108._4_4_ * auVar108._4_4_;
      auVar32._0_4_ = auVar108._0_4_ * auVar108._0_4_;
      auVar32._8_4_ = auVar108._8_4_ * auVar108._8_4_;
      auVar32._12_4_ = auVar108._12_4_ * auVar108._12_4_;
      auVar32._16_4_ = auVar108._16_4_ * auVar108._16_4_;
      auVar32._20_4_ = auVar108._20_4_ * auVar108._20_4_;
      auVar32._24_4_ = auVar108._24_4_ * auVar108._24_4_;
      auVar32._28_4_ = auVar108._28_4_;
      auVar21 = vcmpps_avx(auVar32,auVar31,2);
      fVar111 = auVar163._0_4_ * 4.7683716e-07;
      auVar102._0_4_ = (float)iVar15;
      local_580._4_12_ = auVar137._4_12_;
      local_580._0_4_ = auVar102._0_4_;
      local_580._16_16_ = auVar120._16_16_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar102._16_4_ = auVar102._0_4_;
      auVar102._20_4_ = auVar102._0_4_;
      auVar102._24_4_ = auVar102._0_4_;
      auVar102._28_4_ = auVar102._0_4_;
      auVar120 = vcmpps_avx(_DAT_01faff40,auVar102,1);
      auVar163 = vpermilps_avx(auVar98,0xaa);
      uVar97 = auVar163._0_8_;
      auVar156._8_8_ = uVar97;
      auVar156._0_8_ = uVar97;
      auVar156._16_8_ = uVar97;
      auVar156._24_8_ = uVar97;
      auVar163 = vpermilps_avx(auVar136,0xaa);
      uVar97 = auVar163._0_8_;
      auVar185._8_8_ = uVar97;
      auVar185._0_8_ = uVar97;
      auVar185._16_8_ = uVar97;
      auVar185._24_8_ = uVar97;
      auVar166 = vpermilps_avx(auVar99,0xaa);
      uVar97 = auVar166._0_8_;
      auVar199._8_8_ = uVar97;
      auVar199._0_8_ = uVar97;
      auVar199._16_8_ = uVar97;
      auVar199._24_8_ = uVar97;
      auVar163 = vshufps_avx(auVar137,auVar137,0xaa);
      uVar97 = auVar163._0_8_;
      auVar108 = auVar120 & auVar21;
      uVar92 = *(uint *)(ray + k * 4 + 0x30);
      local_800._0_16_ = ZEXT416(uVar92);
      local_830 = auVar8._0_8_;
      uStack_828 = auVar8._8_8_;
      local_840 = auVar9._0_8_;
      uStack_838 = auVar9._8_8_;
      local_850 = auVar10._0_8_;
      uStack_848 = auVar10._8_8_;
      local_860._0_4_ = auVar11._0_4_;
      fVar22 = (float)local_860;
      local_860._4_4_ = auVar11._4_4_;
      fVar216 = local_860._4_4_;
      uStack_858._0_4_ = auVar11._8_4_;
      fVar218 = (float)uStack_858;
      uStack_858._4_4_ = auVar11._12_4_;
      fVar219 = uStack_858._4_4_;
      local_860 = auVar11._0_8_;
      uStack_858 = auVar11._8_8_;
      uVar209 = uVar97;
      uVar210 = uVar97;
      uVar211 = uVar97;
      fStack_51c = local_520;
      fStack_518 = local_520;
      fStack_514 = local_520;
      fStack_510 = local_520;
      fStack_50c = local_520;
      fStack_508 = local_520;
      fStack_504 = local_520;
      uStack_4f8 = local_500;
      uStack_4f0 = local_500;
      uStack_4e8 = local_500;
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar108[0x1f]) {
        auVar134 = ZEXT3264(local_740);
        auVar159 = ZEXT3264(local_660);
        auVar225 = ZEXT3264(local_720);
        auVar203 = ZEXT3264(local_7e0);
      }
      else {
        local_3e0 = vandps_avx(auVar21,auVar120);
        fVar204 = auVar163._0_4_;
        fVar208 = auVar163._4_4_;
        auVar33._4_4_ = fVar208 * fVar114;
        auVar33._0_4_ = fVar204 * fVar113;
        auVar33._8_4_ = fVar204 * fVar115;
        auVar33._12_4_ = fVar208 * fVar116;
        auVar33._16_4_ = fVar204 * fVar117;
        auVar33._20_4_ = fVar208 * fVar186;
        auVar33._24_4_ = fVar204 * fVar87;
        auVar33._28_4_ = local_3e0._28_4_;
        auVar163 = vfmadd213ps_fma(auVar149,auVar199,auVar33);
        auVar163 = vfmadd213ps_fma(auVar23,auVar185,ZEXT1632(auVar163));
        auVar163 = vfmadd213ps_fma(auVar191,auVar156,ZEXT1632(auVar163));
        _local_400 = ZEXT1632(auVar163);
        auVar34._4_4_ = fVar208 * fStack_39c;
        auVar34._0_4_ = fVar204 * local_3a0;
        auVar34._8_4_ = fVar204 * fStack_398;
        auVar34._12_4_ = fVar208 * fStack_394;
        auVar34._16_4_ = fVar204 * fStack_390;
        auVar34._20_4_ = fVar208 * fStack_38c;
        auVar34._24_4_ = fVar204 * fStack_388;
        auVar34._28_4_ = local_3e0._28_4_;
        auVar163 = vfmadd213ps_fma(auVar181,auVar199,auVar34);
        auVar163 = vfmadd213ps_fma(auVar106,auVar185,ZEXT1632(auVar163));
        auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar181 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        fVar113 = *(float *)(bspline_basis0 + lVar24 + 0x1f9c);
        fVar114 = *(float *)(bspline_basis0 + lVar24 + 0x1fa0);
        fVar115 = *(float *)(bspline_basis0 + lVar24 + 0x1fa4);
        fVar116 = *(float *)(bspline_basis0 + lVar24 + 0x1fa8);
        fVar117 = *(float *)(bspline_basis0 + lVar24 + 0x1fac);
        fVar186 = *(float *)(bspline_basis0 + lVar24 + 0x1fb0);
        fVar87 = *(float *)(bspline_basis0 + lVar24 + 0x1fb4);
        auVar174._0_4_ = local_520 * fVar113;
        auVar174._4_4_ = local_520 * fVar114;
        auVar174._8_4_ = local_520 * fVar115;
        auVar174._12_4_ = local_520 * fVar116;
        auVar174._16_4_ = local_520 * fVar117;
        auVar174._20_4_ = local_520 * fVar186;
        auVar174._24_4_ = local_520 * fVar87;
        auVar174._28_4_ = 0;
        auVar190._0_4_ = fVar135 * fVar113;
        auVar190._4_4_ = fVar112 * fVar114;
        auVar190._8_4_ = fVar135 * fVar115;
        auVar190._12_4_ = fVar112 * fVar116;
        auVar190._16_4_ = fVar135 * fVar117;
        auVar190._20_4_ = fVar112 * fVar186;
        auVar190._24_4_ = fVar135 * fVar87;
        auVar190._28_4_ = 0;
        auVar35._4_4_ = fVar114 * fVar208;
        auVar35._0_4_ = fVar113 * fVar204;
        auVar35._8_4_ = fVar115 * fVar204;
        auVar35._12_4_ = fVar116 * fVar208;
        auVar35._16_4_ = fVar117 * fVar204;
        auVar35._20_4_ = fVar186 * fVar208;
        auVar35._24_4_ = fVar87 * fVar204;
        auVar35._28_4_ = auVar166._4_4_;
        auVar166 = vfmadd231ps_fma(auVar174,auVar106,local_740);
        auVar5 = vfmadd231ps_fma(auVar190,auVar106,local_660);
        auVar7 = vfmadd231ps_fma(auVar35,auVar199,auVar106);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar181,local_720);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar181,local_560);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar185,auVar181);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar120,local_7e0);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar120,local_540);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar120,auVar156);
        fVar113 = *(float *)(bspline_basis1 + lVar24 + 0x1f9c);
        fVar114 = *(float *)(bspline_basis1 + lVar24 + 0x1fa0);
        fVar115 = *(float *)(bspline_basis1 + lVar24 + 0x1fa4);
        fVar116 = *(float *)(bspline_basis1 + lVar24 + 0x1fa8);
        fVar117 = *(float *)(bspline_basis1 + lVar24 + 0x1fac);
        fVar186 = *(float *)(bspline_basis1 + lVar24 + 0x1fb0);
        fVar87 = *(float *)(bspline_basis1 + lVar24 + 0x1fb4);
        auVar181._4_4_ = local_520 * fVar114;
        auVar181._0_4_ = local_520 * fVar113;
        auVar181._8_4_ = local_520 * fVar115;
        auVar181._12_4_ = local_520 * fVar116;
        auVar181._16_4_ = local_520 * fVar117;
        auVar181._20_4_ = local_520 * fVar186;
        auVar181._24_4_ = local_520 * fVar87;
        auVar181._28_4_ = local_520;
        auVar36._4_4_ = fVar112 * fVar114;
        auVar36._0_4_ = fVar135 * fVar113;
        auVar36._8_4_ = fVar135 * fVar115;
        auVar36._12_4_ = fVar112 * fVar116;
        auVar36._16_4_ = fVar135 * fVar117;
        auVar36._20_4_ = fVar112 * fVar186;
        auVar36._24_4_ = fVar135 * fVar87;
        auVar36._28_4_ = fVar112;
        uStack_6f8 = uVar97;
        local_700 = uVar97;
        uStack_6f0 = uVar97;
        uStack_6e8 = uVar97;
        auVar37._4_4_ = fVar208 * fVar114;
        auVar37._0_4_ = fVar204 * fVar113;
        auVar37._8_4_ = fVar204 * fVar115;
        auVar37._12_4_ = fVar208 * fVar116;
        auVar37._16_4_ = fVar204 * fVar117;
        auVar37._20_4_ = fVar208 * fVar186;
        auVar37._24_4_ = fVar204 * fVar87;
        auVar37._28_4_ = fVar208;
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar11 = vfmadd231ps_fma(auVar181,auVar120,local_740);
        auVar98 = vfmadd231ps_fma(auVar36,auVar120,local_660);
        auVar136 = vfmadd231ps_fma(auVar37,auVar199,auVar120);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,local_720);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar120,local_560);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar185,auVar120);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,local_7e0);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar120,local_540);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar156,auVar120);
        auVar120 = vandps_avx(local_1a0,ZEXT1632(auVar166));
        auVar181 = vandps_avx(ZEXT1632(auVar5),local_1a0);
        auVar181 = vmaxps_avx(auVar120,auVar181);
        auVar120 = vandps_avx(ZEXT1632(auVar7),local_1a0);
        auVar120 = vmaxps_avx(auVar181,auVar120);
        auVar124._4_4_ = fVar111;
        auVar124._0_4_ = fVar111;
        auVar124._8_4_ = fVar111;
        auVar124._12_4_ = fVar111;
        auVar124._16_4_ = fVar111;
        auVar124._20_4_ = fVar111;
        auVar124._24_4_ = fVar111;
        auVar124._28_4_ = fVar111;
        auVar120 = vcmpps_avx(auVar120,auVar124,1);
        auVar106 = vblendvps_avx(ZEXT1632(auVar166),local_3c0,auVar120);
        auVar149 = vblendvps_avx(ZEXT1632(auVar5),local_380,auVar120);
        auVar120 = vandps_avx(ZEXT1632(auVar11),local_1a0);
        auVar181 = vandps_avx(ZEXT1632(auVar98),local_1a0);
        auVar181 = vmaxps_avx(auVar120,auVar181);
        auVar120 = vandps_avx(ZEXT1632(auVar136),local_1a0);
        auVar120 = vmaxps_avx(auVar181,auVar120);
        auVar181 = vcmpps_avx(auVar120,auVar124,1);
        auVar120 = vblendvps_avx(ZEXT1632(auVar11),local_3c0,auVar181);
        auVar181 = vblendvps_avx(ZEXT1632(auVar98),local_380,auVar181);
        auVar163 = vfmadd213ps_fma(auVar127,auVar156,ZEXT1632(auVar163));
        fVar186 = -auVar120._4_4_;
        auVar166 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar149,auVar149);
        auVar23 = vrsqrtps_avx(ZEXT1632(auVar166));
        fVar135 = auVar23._0_4_;
        fVar112 = auVar23._4_4_;
        fVar113 = auVar23._8_4_;
        fVar114 = auVar23._12_4_;
        fVar115 = auVar23._16_4_;
        fVar116 = auVar23._20_4_;
        fVar117 = auVar23._24_4_;
        auVar38._4_4_ = fVar112 * fVar112 * fVar112 * auVar166._4_4_ * -0.5;
        auVar38._0_4_ = fVar135 * fVar135 * fVar135 * auVar166._0_4_ * -0.5;
        auVar38._8_4_ = fVar113 * fVar113 * fVar113 * auVar166._8_4_ * -0.5;
        auVar38._12_4_ = fVar114 * fVar114 * fVar114 * auVar166._12_4_ * -0.5;
        auVar38._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar38._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar38._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar38._28_4_ = 0;
        auVar215._8_4_ = 0x3fc00000;
        auVar215._0_8_ = 0x3fc000003fc00000;
        auVar215._12_4_ = 0x3fc00000;
        auVar215._16_4_ = 0x3fc00000;
        auVar215._20_4_ = 0x3fc00000;
        auVar215._24_4_ = 0x3fc00000;
        auVar215._28_4_ = 0x3fc00000;
        auVar166 = vfmadd231ps_fma(auVar38,auVar215,auVar23);
        fVar135 = auVar166._0_4_;
        fVar112 = auVar166._4_4_;
        auVar39._4_4_ = auVar149._4_4_ * fVar112;
        auVar39._0_4_ = auVar149._0_4_ * fVar135;
        fVar113 = auVar166._8_4_;
        auVar39._8_4_ = auVar149._8_4_ * fVar113;
        fVar114 = auVar166._12_4_;
        auVar39._12_4_ = auVar149._12_4_ * fVar114;
        auVar39._16_4_ = auVar149._16_4_ * 0.0;
        auVar39._20_4_ = auVar149._20_4_ * 0.0;
        auVar39._24_4_ = auVar149._24_4_ * 0.0;
        auVar39._28_4_ = auVar23._28_4_;
        auVar40._4_4_ = -auVar106._4_4_ * fVar112;
        auVar40._0_4_ = -auVar106._0_4_ * fVar135;
        auVar40._8_4_ = -auVar106._8_4_ * fVar113;
        auVar40._12_4_ = -auVar106._12_4_ * fVar114;
        auVar40._16_4_ = -auVar106._16_4_ * 0.0;
        auVar40._20_4_ = -auVar106._20_4_ * 0.0;
        auVar40._24_4_ = -auVar106._24_4_ * 0.0;
        auVar40._28_4_ = 0;
        auVar166 = vfmadd213ps_fma(auVar120,auVar120,ZEXT832(0) << 0x20);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar181,auVar181);
        auVar106 = vrsqrtps_avx(ZEXT1632(auVar166));
        auVar149 = ZEXT1632(CONCAT412(fVar114 * 0.0,
                                      CONCAT48(fVar113 * 0.0,CONCAT44(fVar112 * 0.0,fVar135 * 0.0)))
                           );
        fVar135 = auVar106._0_4_;
        fVar112 = auVar106._4_4_;
        fVar113 = auVar106._8_4_;
        fVar114 = auVar106._12_4_;
        fVar115 = auVar106._16_4_;
        fVar116 = auVar106._20_4_;
        fVar117 = auVar106._24_4_;
        auVar41._4_4_ = fVar112 * fVar112 * fVar112 * auVar166._4_4_ * -0.5;
        auVar41._0_4_ = fVar135 * fVar135 * fVar135 * auVar166._0_4_ * -0.5;
        auVar41._8_4_ = fVar113 * fVar113 * fVar113 * auVar166._8_4_ * -0.5;
        auVar41._12_4_ = fVar114 * fVar114 * fVar114 * auVar166._12_4_ * -0.5;
        auVar41._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar41._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar41._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
        auVar41._28_4_ = 0xbf000000;
        auVar166 = vfmadd231ps_fma(auVar41,auVar215,auVar106);
        fVar135 = auVar166._0_4_;
        fVar112 = auVar166._4_4_;
        auVar42._4_4_ = fVar112 * auVar181._4_4_;
        auVar42._0_4_ = fVar135 * auVar181._0_4_;
        fVar113 = auVar166._8_4_;
        auVar42._8_4_ = fVar113 * auVar181._8_4_;
        fVar114 = auVar166._12_4_;
        auVar42._12_4_ = fVar114 * auVar181._12_4_;
        auVar42._16_4_ = auVar181._16_4_ * 0.0;
        auVar42._20_4_ = auVar181._20_4_ * 0.0;
        auVar42._24_4_ = auVar181._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar43._4_4_ = fVar112 * fVar186;
        auVar43._0_4_ = fVar135 * -auVar120._0_4_;
        auVar43._8_4_ = fVar113 * -auVar120._8_4_;
        auVar43._12_4_ = fVar114 * -auVar120._12_4_;
        auVar43._16_4_ = -auVar120._16_4_ * 0.0;
        auVar43._20_4_ = -auVar120._20_4_ * 0.0;
        auVar43._24_4_ = -auVar120._24_4_ * 0.0;
        auVar43._28_4_ = 0x3fc00000;
        auVar44._28_4_ = auVar106._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar114 * 0.0,
                                CONCAT48(fVar113 * 0.0,CONCAT44(fVar112 * 0.0,fVar135 * 0.0))));
        auVar166 = vfmadd213ps_fma(auVar39,auVar224,auVar122);
        auVar5 = vfmadd213ps_fma(auVar40,auVar224,local_360);
        auVar7 = vfmadd213ps_fma(auVar149,auVar224,ZEXT1632(auVar163));
        auVar137 = vfnmadd213ps_fma(auVar39,auVar224,auVar122);
        auVar11 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar6),auVar100);
        auVar25 = vfnmadd213ps_fma(auVar40,auVar224,local_360);
        auVar181 = ZEXT1632(auVar6);
        auVar98 = vfmadd213ps_fma(auVar43,auVar181,local_340);
        auVar154 = vfnmadd231ps_fma(ZEXT1632(auVar163),auVar224,auVar149);
        auVar136 = vfmadd213ps_fma(auVar44,auVar181,_local_400);
        auVar138 = vfnmadd213ps_fma(auVar42,auVar181,auVar100);
        auVar153 = vfnmadd213ps_fma(auVar43,auVar181,local_340);
        auVar160 = vfnmadd231ps_fma(_local_400,ZEXT1632(auVar6),auVar44);
        auVar181 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar25));
        auVar106 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar154));
        auVar150._0_4_ = auVar154._0_4_ * auVar181._0_4_;
        auVar150._4_4_ = auVar154._4_4_ * auVar181._4_4_;
        auVar150._8_4_ = auVar154._8_4_ * auVar181._8_4_;
        auVar150._12_4_ = auVar154._12_4_ * auVar181._12_4_;
        auVar150._16_4_ = auVar181._16_4_ * 0.0;
        auVar150._20_4_ = auVar181._20_4_ * 0.0;
        auVar150._24_4_ = auVar181._24_4_ * 0.0;
        auVar150._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar150,ZEXT1632(auVar25),auVar106);
        auVar45._4_4_ = auVar137._4_4_ * auVar106._4_4_;
        auVar45._0_4_ = auVar137._0_4_ * auVar106._0_4_;
        auVar45._8_4_ = auVar137._8_4_ * auVar106._8_4_;
        auVar45._12_4_ = auVar137._12_4_ * auVar106._12_4_;
        auVar45._16_4_ = auVar106._16_4_ * 0.0;
        auVar45._20_4_ = auVar106._20_4_ * 0.0;
        auVar45._24_4_ = auVar106._24_4_ * 0.0;
        auVar45._28_4_ = auVar106._28_4_;
        auVar191 = ZEXT1632(auVar137);
        auVar106 = vsubps_avx(ZEXT1632(auVar11),auVar191);
        auVar163 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar154),auVar106);
        auVar46._4_4_ = auVar25._4_4_ * auVar106._4_4_;
        auVar46._0_4_ = auVar25._0_4_ * auVar106._0_4_;
        auVar46._8_4_ = auVar25._8_4_ * auVar106._8_4_;
        auVar46._12_4_ = auVar25._12_4_ * auVar106._12_4_;
        auVar46._16_4_ = auVar106._16_4_ * 0.0;
        auVar46._20_4_ = auVar106._20_4_ * 0.0;
        auVar46._24_4_ = auVar106._24_4_ * 0.0;
        auVar46._28_4_ = auVar106._28_4_;
        auVar137 = vfmsub231ps_fma(auVar46,auVar191,auVar181);
        auVar86._4_8_ = 0;
        auVar86._0_4_ = (uint)-auVar120._4_4_ ^ (uint)fVar186;
        auVar163 = vfmadd231ps_fma(ZEXT1632(auVar137),ZEXT1232(auVar86) << 0x20,ZEXT1632(auVar163));
        local_680._16_16_ = auVar127._16_16_;
        auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),ZEXT1232(auVar86) << 0x20,ZEXT1632(auVar99));
        auVar100 = vcmpps_avx(ZEXT1632(auVar163),ZEXT1232(auVar86) << 0x20,2);
        auVar120 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar166),auVar100);
        auVar181 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar5),auVar100);
        auVar106 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar7),auVar100);
        auVar127 = vblendvps_avx(auVar191,ZEXT1632(auVar11),auVar100);
        auVar149 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar98),auVar100);
        auVar23 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar136),auVar100);
        auVar191 = vblendvps_avx(ZEXT1632(auVar11),auVar191,auVar100);
        auVar21 = vblendvps_avx(ZEXT1632(auVar98),ZEXT1632(auVar25),auVar100);
        auVar163 = vpackssdw_avx(local_3e0._0_16_,local_3e0._16_16_);
        auVar108 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar154),auVar100);
        auVar122 = vsubps_avx(auVar191,auVar120);
        auVar21 = vsubps_avx(auVar21,auVar181);
        auVar194 = ZEXT3264(auVar21);
        auVar147 = vsubps_avx(auVar108,auVar106);
        auVar148 = vsubps_avx(auVar120,auVar127);
        auVar155 = vsubps_avx(auVar181,auVar149);
        auVar180 = vsubps_avx(auVar106,auVar23);
        auVar47._4_4_ = auVar147._4_4_ * auVar120._4_4_;
        auVar47._0_4_ = auVar147._0_4_ * auVar120._0_4_;
        auVar47._8_4_ = auVar147._8_4_ * auVar120._8_4_;
        auVar47._12_4_ = auVar147._12_4_ * auVar120._12_4_;
        auVar47._16_4_ = auVar147._16_4_ * auVar120._16_4_;
        auVar47._20_4_ = auVar147._20_4_ * auVar120._20_4_;
        auVar47._24_4_ = auVar147._24_4_ * auVar120._24_4_;
        auVar47._28_4_ = auVar108._28_4_;
        auVar166 = vfmsub231ps_fma(auVar47,auVar106,auVar122);
        auVar48._4_4_ = auVar122._4_4_ * auVar181._4_4_;
        auVar48._0_4_ = auVar122._0_4_ * auVar181._0_4_;
        auVar48._8_4_ = auVar122._8_4_ * auVar181._8_4_;
        auVar48._12_4_ = auVar122._12_4_ * auVar181._12_4_;
        auVar48._16_4_ = auVar122._16_4_ * auVar181._16_4_;
        auVar48._20_4_ = auVar122._20_4_ * auVar181._20_4_;
        auVar48._24_4_ = auVar122._24_4_ * auVar181._24_4_;
        auVar48._28_4_ = auVar191._28_4_;
        auVar5 = vfmsub231ps_fma(auVar48,auVar120,auVar21);
        auVar179 = ZEXT3264(auVar181);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
        auVar103._0_4_ = auVar21._0_4_ * auVar106._0_4_;
        auVar103._4_4_ = auVar21._4_4_ * auVar106._4_4_;
        auVar103._8_4_ = auVar21._8_4_ * auVar106._8_4_;
        auVar103._12_4_ = auVar21._12_4_ * auVar106._12_4_;
        auVar103._16_4_ = auVar21._16_4_ * auVar106._16_4_;
        auVar103._20_4_ = auVar21._20_4_ * auVar106._20_4_;
        auVar103._24_4_ = auVar21._24_4_ * auVar106._24_4_;
        auVar103._28_4_ = 0;
        auVar5 = vfmsub231ps_fma(auVar103,auVar181,auVar147);
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
        auVar104._0_4_ = auVar180._0_4_ * auVar127._0_4_;
        auVar104._4_4_ = auVar180._4_4_ * auVar127._4_4_;
        auVar104._8_4_ = auVar180._8_4_ * auVar127._8_4_;
        auVar104._12_4_ = auVar180._12_4_ * auVar127._12_4_;
        auVar104._16_4_ = auVar180._16_4_ * auVar127._16_4_;
        auVar104._20_4_ = auVar180._20_4_ * auVar127._20_4_;
        auVar104._24_4_ = auVar180._24_4_ * auVar127._24_4_;
        auVar104._28_4_ = 0;
        auVar166 = vfmsub231ps_fma(auVar104,auVar148,auVar23);
        auVar49._4_4_ = auVar155._4_4_ * auVar23._4_4_;
        auVar49._0_4_ = auVar155._0_4_ * auVar23._0_4_;
        auVar49._8_4_ = auVar155._8_4_ * auVar23._8_4_;
        auVar49._12_4_ = auVar155._12_4_ * auVar23._12_4_;
        auVar49._16_4_ = auVar155._16_4_ * auVar23._16_4_;
        auVar49._20_4_ = auVar155._20_4_ * auVar23._20_4_;
        auVar49._24_4_ = auVar155._24_4_ * auVar23._24_4_;
        auVar49._28_4_ = auVar23._28_4_;
        auVar7 = vfmsub231ps_fma(auVar49,auVar149,auVar180);
        auVar50._4_4_ = auVar148._4_4_ * auVar149._4_4_;
        auVar50._0_4_ = auVar148._0_4_ * auVar149._0_4_;
        auVar50._8_4_ = auVar148._8_4_ * auVar149._8_4_;
        auVar50._12_4_ = auVar148._12_4_ * auVar149._12_4_;
        auVar50._16_4_ = auVar148._16_4_ * auVar149._16_4_;
        auVar50._20_4_ = auVar148._20_4_ * auVar149._20_4_;
        auVar50._24_4_ = auVar148._24_4_ * auVar149._24_4_;
        auVar50._28_4_ = auVar149._28_4_;
        auVar11 = vfmsub231ps_fma(auVar50,auVar155,auVar127);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar127 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar7));
        auVar127 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,2);
        auVar166 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
        auVar163 = vpand_avx(auVar163,auVar166);
        auVar127 = vpmovsxwd_avx2(auVar163);
        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar127 >> 0x7f,0) == '\0') &&
              (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar127 >> 0xbf,0) == '\0') &&
            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar127[0x1f]) {
LAB_018ab457:
          auVar172._8_8_ = uStack_5f8;
          auVar172._0_8_ = local_600;
          auVar172._16_8_ = uStack_5f0;
          auVar172._24_8_ = uStack_5e8;
        }
        else {
          auVar51._4_4_ = auVar21._4_4_ * auVar180._4_4_;
          auVar51._0_4_ = auVar21._0_4_ * auVar180._0_4_;
          auVar51._8_4_ = auVar21._8_4_ * auVar180._8_4_;
          auVar51._12_4_ = auVar21._12_4_ * auVar180._12_4_;
          auVar51._16_4_ = auVar21._16_4_ * auVar180._16_4_;
          auVar51._20_4_ = auVar21._20_4_ * auVar180._20_4_;
          auVar51._24_4_ = auVar21._24_4_ * auVar180._24_4_;
          auVar51._28_4_ = auVar127._28_4_;
          auVar136 = vfmsub231ps_fma(auVar51,auVar155,auVar147);
          auVar125._0_4_ = auVar148._0_4_ * auVar147._0_4_;
          auVar125._4_4_ = auVar148._4_4_ * auVar147._4_4_;
          auVar125._8_4_ = auVar148._8_4_ * auVar147._8_4_;
          auVar125._12_4_ = auVar148._12_4_ * auVar147._12_4_;
          auVar125._16_4_ = auVar148._16_4_ * auVar147._16_4_;
          auVar125._20_4_ = auVar148._20_4_ * auVar147._20_4_;
          auVar125._24_4_ = auVar148._24_4_ * auVar147._24_4_;
          auVar125._28_4_ = 0;
          auVar98 = vfmsub231ps_fma(auVar125,auVar122,auVar180);
          auVar52._4_4_ = auVar122._4_4_ * auVar155._4_4_;
          auVar52._0_4_ = auVar122._0_4_ * auVar155._0_4_;
          auVar52._8_4_ = auVar122._8_4_ * auVar155._8_4_;
          auVar52._12_4_ = auVar122._12_4_ * auVar155._12_4_;
          auVar52._16_4_ = auVar122._16_4_ * auVar155._16_4_;
          auVar52._20_4_ = auVar122._20_4_ * auVar155._20_4_;
          auVar52._24_4_ = auVar122._24_4_ * auVar155._24_4_;
          auVar52._28_4_ = auVar122._28_4_;
          auVar99 = vfmsub231ps_fma(auVar52,auVar148,auVar21);
          auVar166 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar98),ZEXT1632(auVar99));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT1632(auVar136),_DAT_01faff00);
          auVar127 = vrcpps_avx(ZEXT1632(auVar11));
          auVar202._8_4_ = 0x3f800000;
          auVar202._0_8_ = 0x3f8000003f800000;
          auVar202._12_4_ = 0x3f800000;
          auVar202._16_4_ = 0x3f800000;
          auVar202._20_4_ = 0x3f800000;
          auVar202._24_4_ = 0x3f800000;
          auVar202._28_4_ = 0x3f800000;
          auVar166 = vfnmadd213ps_fma(auVar127,ZEXT1632(auVar11),auVar202);
          auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar127,auVar127);
          auVar194 = ZEXT1664(auVar166);
          auVar53._4_4_ = auVar99._4_4_ * auVar106._4_4_;
          auVar53._0_4_ = auVar99._0_4_ * auVar106._0_4_;
          auVar53._8_4_ = auVar99._8_4_ * auVar106._8_4_;
          auVar53._12_4_ = auVar99._12_4_ * auVar106._12_4_;
          auVar53._16_4_ = auVar106._16_4_ * 0.0;
          auVar53._20_4_ = auVar106._20_4_ * 0.0;
          auVar53._24_4_ = auVar106._24_4_ * 0.0;
          auVar53._28_4_ = auVar106._28_4_;
          auVar98 = vfmadd231ps_fma(auVar53,auVar181,ZEXT1632(auVar98));
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT1632(auVar136),auVar120);
          fVar135 = auVar166._0_4_;
          fVar112 = auVar166._4_4_;
          fVar113 = auVar166._8_4_;
          fVar114 = auVar166._12_4_;
          auVar54._28_4_ = auVar181._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar114 * auVar98._12_4_,
                                  CONCAT48(fVar113 * auVar98._8_4_,
                                           CONCAT44(fVar112 * auVar98._4_4_,fVar135 * auVar98._0_4_)
                                          )));
          auVar179 = ZEXT3264(auVar54);
          auVar105._4_4_ = uVar92;
          auVar105._0_4_ = uVar92;
          auVar105._8_4_ = uVar92;
          auVar105._12_4_ = uVar92;
          auVar105._16_4_ = uVar92;
          auVar105._20_4_ = uVar92;
          auVar105._24_4_ = uVar92;
          auVar105._28_4_ = uVar92;
          uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar126._4_4_ = uVar96;
          auVar126._0_4_ = uVar96;
          auVar126._8_4_ = uVar96;
          auVar126._12_4_ = uVar96;
          auVar126._16_4_ = uVar96;
          auVar126._20_4_ = uVar96;
          auVar126._24_4_ = uVar96;
          auVar126._28_4_ = uVar96;
          auVar120 = vcmpps_avx(auVar105,auVar54,2);
          auVar181 = vcmpps_avx(auVar54,auVar126,2);
          auVar120 = vandps_avx(auVar181,auVar120);
          auVar166 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          auVar163 = vpand_avx(auVar163,auVar166);
          auVar120 = vpmovsxwd_avx2(auVar163);
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar120 >> 0x7f,0) == '\0') &&
                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar120 >> 0xbf,0) == '\0') &&
              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar120[0x1f]) goto LAB_018ab457;
          auVar120 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,4);
          auVar166 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          auVar163 = vpand_avx(auVar163,auVar166);
          auVar120 = vpmovsxwd_avx2(auVar163);
          auVar172._8_8_ = uStack_5f8;
          auVar172._0_8_ = local_600;
          auVar172._16_8_ = uStack_5f0;
          auVar172._24_8_ = uStack_5e8;
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar120 >> 0x7f,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0xbf,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar120[0x1f] < '\0') {
            auVar106 = ZEXT1632(CONCAT412(fVar114 * auVar5._12_4_,
                                          CONCAT48(fVar113 * auVar5._8_4_,
                                                   CONCAT44(fVar112 * auVar5._4_4_,
                                                            fVar135 * auVar5._0_4_))));
            auVar127 = ZEXT1632(CONCAT412(fVar114 * auVar7._12_4_,
                                          CONCAT48(fVar113 * auVar7._8_4_,
                                                   CONCAT44(fVar112 * auVar7._4_4_,
                                                            fVar135 * auVar7._0_4_))));
            auVar171._8_4_ = 0x3f800000;
            auVar171._0_8_ = 0x3f8000003f800000;
            auVar171._12_4_ = 0x3f800000;
            auVar171._16_4_ = 0x3f800000;
            auVar171._20_4_ = 0x3f800000;
            auVar171._24_4_ = 0x3f800000;
            auVar171._28_4_ = 0x3f800000;
            auVar181 = vsubps_avx(auVar171,auVar106);
            _local_180 = vblendvps_avx(auVar181,auVar106,auVar100);
            auVar181 = vsubps_avx(auVar171,auVar127);
            local_420 = vblendvps_avx(auVar181,auVar127,auVar100);
            auVar172 = auVar120;
            local_5c0 = auVar54;
          }
        }
        auVar225 = ZEXT3264(local_720);
        auVar203 = ZEXT3264(local_7e0);
        auVar159 = ZEXT3264(auVar199);
        auVar134 = ZEXT3264(auVar156);
        if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar172 >> 0x7f,0) == '\0') &&
              (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar172 >> 0xbf,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar172[0x1f]) {
          auVar134 = ZEXT3264(local_740);
          auVar159 = ZEXT3264(local_660);
        }
        else {
          auVar120 = vsubps_avx(ZEXT1632(auVar6),auVar224);
          auVar163 = vfmadd213ps_fma(auVar120,_local_180,auVar224);
          fVar135 = *(float *)((long)local_808->ray_space + k * 4 + -0x10);
          auVar55._4_4_ = (auVar163._4_4_ + auVar163._4_4_) * fVar135;
          auVar55._0_4_ = (auVar163._0_4_ + auVar163._0_4_) * fVar135;
          auVar55._8_4_ = (auVar163._8_4_ + auVar163._8_4_) * fVar135;
          auVar55._12_4_ = (auVar163._12_4_ + auVar163._12_4_) * fVar135;
          auVar55._16_4_ = fVar135 * 0.0;
          auVar55._20_4_ = fVar135 * 0.0;
          auVar55._24_4_ = fVar135 * 0.0;
          auVar55._28_4_ = 0;
          auVar120 = vcmpps_avx(local_5c0,auVar55,6);
          auVar181 = auVar172 & auVar120;
          auVar226 = ZEXT3264(auVar185);
          if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar181 >> 0x7f,0) != '\0') ||
                (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar181 >> 0xbf,0) != '\0') ||
              (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar181[0x1f] < '\0') {
            auVar128._8_4_ = 0xbf800000;
            auVar128._0_8_ = 0xbf800000bf800000;
            auVar128._12_4_ = 0xbf800000;
            auVar128._16_4_ = 0xbf800000;
            auVar128._20_4_ = 0xbf800000;
            auVar128._24_4_ = 0xbf800000;
            auVar128._28_4_ = 0xbf800000;
            auVar151._8_4_ = 0x40000000;
            auVar151._0_8_ = 0x4000000040000000;
            auVar151._12_4_ = 0x40000000;
            auVar151._16_4_ = 0x40000000;
            auVar151._20_4_ = 0x40000000;
            auVar151._24_4_ = 0x40000000;
            auVar151._28_4_ = 0x40000000;
            auVar163 = vfmadd213ps_fma(local_420,auVar151,auVar128);
            auVar179 = ZEXT1664(auVar163);
            local_2e0 = _local_180;
            local_420 = ZEXT1632(auVar163);
            auVar181 = local_420;
            local_2c0 = ZEXT1632(auVar163);
            local_2a0 = local_5c0;
            local_280 = 0;
            local_27c = iVar15;
            local_270 = local_830;
            uStack_268 = uStack_828;
            local_260 = local_840;
            uStack_258 = uStack_838;
            local_250 = local_850;
            uStack_248 = uStack_848;
            local_240 = local_860;
            uStack_238 = uStack_858;
            local_420 = auVar181;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_640 = vandps_avx(auVar120,auVar172);
              fVar135 = 1.0 / auVar102._0_4_;
              local_200[0] = fVar135 * ((float)local_180._0_4_ + 0.0);
              local_200[1] = fVar135 * ((float)local_180._4_4_ + 1.0);
              local_200[2] = fVar135 * (fStack_178 + 2.0);
              local_200[3] = fVar135 * (fStack_174 + 3.0);
              fStack_1f0 = fVar135 * (fStack_170 + 4.0);
              fStack_1ec = fVar135 * (fStack_16c + 5.0);
              fStack_1e8 = fVar135 * (fStack_168 + 6.0);
              fStack_1e4 = fStack_164 + 7.0;
              local_420._0_8_ = auVar163._0_8_;
              local_420._8_8_ = auVar163._8_8_;
              local_1e0 = local_420._0_8_;
              uStack_1d8 = local_420._8_8_;
              uStack_1d0 = 0;
              uStack_1c8 = 0;
              local_1c0 = local_5c0;
              auVar129._8_4_ = 0x7f800000;
              auVar129._0_8_ = 0x7f8000007f800000;
              auVar129._12_4_ = 0x7f800000;
              auVar129._16_4_ = 0x7f800000;
              auVar129._20_4_ = 0x7f800000;
              auVar129._24_4_ = 0x7f800000;
              auVar129._28_4_ = 0x7f800000;
              auVar120 = vblendvps_avx(auVar129,local_5c0,local_640);
              auVar181 = vshufps_avx(auVar120,auVar120,0xb1);
              auVar181 = vminps_avx(auVar120,auVar181);
              auVar106 = vshufpd_avx(auVar181,auVar181,5);
              auVar181 = vminps_avx(auVar181,auVar106);
              auVar106 = vpermpd_avx2(auVar181,0x4e);
              auVar181 = vminps_avx(auVar181,auVar106);
              auVar181 = vcmpps_avx(auVar120,auVar181,0);
              auVar106 = local_640 & auVar181;
              auVar120 = local_640;
              if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0x7f,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar106 >> 0xbf,0) != '\0') ||
                  (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar106[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar181,local_640);
              }
              uVar90 = vmovmskps_avx(auVar120);
              uVar92 = 0;
              for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar92 = uVar92 + 1;
              }
              uVar91 = (ulong)uVar92;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar135 = local_200[uVar91];
                uVar96 = *(undefined4 *)((long)&local_1e0 + uVar91 * 4);
                fVar112 = 1.0 - fVar135;
                auVar163 = ZEXT416((uint)(fVar135 * fVar112 * 4.0));
                auVar166 = vfnmsub213ss_fma(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),auVar163);
                auVar163 = vfmadd213ss_fma(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),auVar163);
                fVar112 = fVar112 * -fVar112 * 0.5;
                fVar113 = auVar166._0_4_ * 0.5;
                auVar179 = ZEXT464((uint)fVar113);
                fVar114 = auVar163._0_4_ * 0.5;
                fVar115 = fVar135 * fVar135 * 0.5;
                auVar161._0_4_ = fVar115 * fVar22;
                auVar161._4_4_ = fVar115 * fVar216;
                auVar161._8_4_ = fVar115 * fVar218;
                auVar161._12_4_ = fVar115 * fVar219;
                auVar139._4_4_ = fVar114;
                auVar139._0_4_ = fVar114;
                auVar139._8_4_ = fVar114;
                auVar139._12_4_ = fVar114;
                auVar163 = vfmadd132ps_fma(auVar139,auVar161,auVar10);
                auVar162._4_4_ = fVar113;
                auVar162._0_4_ = fVar113;
                auVar162._8_4_ = fVar113;
                auVar162._12_4_ = fVar113;
                auVar163 = vfmadd132ps_fma(auVar162,auVar163,auVar9);
                auVar140._4_4_ = fVar112;
                auVar140._0_4_ = fVar112;
                auVar140._8_4_ = fVar112;
                auVar140._12_4_ = fVar112;
                auVar163 = vfmadd132ps_fma(auVar140,auVar163,auVar8);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar91 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar163._0_4_;
                uVar16 = vextractps_avx(auVar163,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                uVar16 = vextractps_avx(auVar163,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                *(float *)(ray + k * 4 + 0xf0) = fVar135;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar96;
                *(uint *)(ray + k * 4 + 0x110) = uVar14;
                *(uint *)(ray + k * 4 + 0x120) = uVar13;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_680._4_4_ = uVar13;
                local_680._0_4_ = uVar13;
                local_680._8_4_ = uVar13;
                local_680._12_4_ = uVar13;
                local_6a0._0_8_ = CONCAT44(uVar14,uVar14);
                local_6a0 = ZEXT1632(CONCAT412(uVar14,CONCAT48(uVar14,local_6a0._0_8_)));
                local_5a0 = ZEXT1632(*local_748);
                local_8a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                local_780 = auVar156;
                local_6e0 = auVar199;
                local_6c0 = auVar185;
                while( true ) {
                  auVar120 = local_8a0;
                  fVar135 = local_200[uVar91];
                  local_4a0._4_4_ = fVar135;
                  local_4a0._0_4_ = fVar135;
                  local_4a0._8_4_ = fVar135;
                  local_4a0._12_4_ = fVar135;
                  local_490 = *(undefined4 *)((long)&local_1e0 + uVar91 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar91 * 4);
                  fVar113 = 1.0 - fVar135;
                  auVar163 = ZEXT416((uint)(fVar135 * fVar113 * 4.0));
                  auVar5 = vfnmsub213ss_fma(local_4a0,local_4a0,auVar163);
                  auVar179 = ZEXT1664(auVar5);
                  auVar163 = vfmadd213ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),auVar163)
                  ;
                  fVar112 = auVar163._0_4_ * 0.5;
                  fVar135 = fVar135 * fVar135 * 0.5;
                  auVar169._0_4_ = fVar135 * fVar22;
                  auVar169._4_4_ = fVar135 * fVar216;
                  auVar169._8_4_ = fVar135 * fVar218;
                  auVar169._12_4_ = fVar135 * fVar219;
                  auVar145._4_4_ = fVar112;
                  auVar145._0_4_ = fVar112;
                  auVar145._8_4_ = fVar112;
                  auVar145._12_4_ = fVar112;
                  auVar163 = vfmadd132ps_fma(auVar145,auVar169,auVar10);
                  fVar135 = auVar5._0_4_ * 0.5;
                  auVar170._4_4_ = fVar135;
                  auVar170._0_4_ = fVar135;
                  auVar170._8_4_ = fVar135;
                  auVar170._12_4_ = fVar135;
                  auVar163 = vfmadd132ps_fma(auVar170,auVar163,auVar9);
                  local_7b0.context = context->user;
                  fVar135 = fVar113 * -fVar113 * 0.5;
                  auVar146._4_4_ = fVar135;
                  auVar146._0_4_ = fVar135;
                  auVar146._8_4_ = fVar135;
                  auVar146._12_4_ = fVar135;
                  auVar166 = vfmadd132ps_fma(auVar146,auVar163,auVar8);
                  uVar96 = auVar166._0_4_;
                  local_4d0[0] = (RTCHitN)(char)uVar96;
                  local_4d0[1] = (RTCHitN)(char)((uint)uVar96 >> 8);
                  local_4d0[2] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                  local_4d0[3] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                  local_4d0[4] = (RTCHitN)(char)uVar96;
                  local_4d0[5] = (RTCHitN)(char)((uint)uVar96 >> 8);
                  local_4d0[6] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                  local_4d0[7] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                  local_4d0[8] = (RTCHitN)(char)uVar96;
                  local_4d0[9] = (RTCHitN)(char)((uint)uVar96 >> 8);
                  local_4d0[10] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                  local_4d0[0xb] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                  local_4d0[0xc] = (RTCHitN)(char)uVar96;
                  local_4d0[0xd] = (RTCHitN)(char)((uint)uVar96 >> 8);
                  local_4d0[0xe] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                  local_4d0[0xf] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                  auVar163 = vshufps_avx(auVar166,auVar166,0x55);
                  local_4c0 = auVar163;
                  local_4b0 = vshufps_avx(auVar166,auVar166,0xaa);
                  uStack_48c = local_490;
                  uStack_488 = local_490;
                  uStack_484 = local_490;
                  local_480 = local_6a0._0_8_;
                  uStack_478 = local_6a0._8_8_;
                  local_470 = local_680._0_16_;
                  vpcmpeqd_avx2(ZEXT1632(local_680._0_16_),ZEXT1632(local_680._0_16_));
                  uStack_45c = (local_7b0.context)->instID[0];
                  local_460 = uStack_45c;
                  uStack_458 = uStack_45c;
                  uStack_454 = uStack_45c;
                  uStack_450 = (local_7b0.context)->instPrimID[0];
                  uStack_44c = uStack_450;
                  uStack_448 = uStack_450;
                  uStack_444 = uStack_450;
                  local_820 = local_5a0._0_16_;
                  local_7b0.valid = (int *)local_820;
                  local_7b0.geometryUserPtr = pGVar17->userPtr;
                  local_7b0.hit = local_4d0;
                  local_7b0.N = 4;
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar179 = ZEXT1664(auVar5);
                    auVar194 = ZEXT1664(auVar194._0_16_);
                    (*pGVar17->intersectionFilterN)(&local_7b0);
                    auVar159 = ZEXT3264(local_6e0);
                    auVar226 = ZEXT3264(local_6c0);
                    auVar134 = ZEXT3264(local_780);
                    auVar203 = ZEXT3264(local_7e0);
                    auVar225 = ZEXT3264(local_720);
                    uVar97 = local_700;
                    uVar209 = uStack_6f8;
                    uVar210 = uStack_6f0;
                    uVar211 = uStack_6e8;
                  }
                  if (local_820 == (undefined1  [16])0x0) {
                    auVar163 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar163 = auVar163 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar179 = ZEXT1664(auVar179._0_16_);
                      auVar194 = ZEXT1664(auVar194._0_16_);
                      (*p_Var20)(&local_7b0);
                      auVar159 = ZEXT3264(local_6e0);
                      auVar226 = ZEXT3264(local_6c0);
                      auVar134 = ZEXT3264(local_780);
                      auVar203 = ZEXT3264(local_7e0);
                      auVar225 = ZEXT3264(local_720);
                      uVar97 = local_700;
                      uVar209 = uStack_6f8;
                      uVar210 = uStack_6f0;
                      uVar211 = uStack_6e8;
                    }
                    auVar166 = vpcmpeqd_avx(local_820,_DAT_01f7aa10);
                    auVar5 = vpcmpeqd_avx(auVar163,auVar163);
                    auVar163 = auVar166 ^ auVar5;
                    if (local_820 != (undefined1  [16])0x0) {
                      auVar166 = auVar166 ^ auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])local_7b0.hit);
                      *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar5;
                      auVar5 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])(local_7b0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar5;
                      auVar166 = vmaskmovps_avx(auVar166,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar166;
                    }
                  }
                  auVar181 = local_5c0;
                  auVar156 = auVar134._0_32_;
                  auVar185 = auVar226._0_32_;
                  auVar199 = auVar159._0_32_;
                  auVar119._8_8_ = 0x100000001;
                  auVar119._0_8_ = 0x100000001;
                  if ((auVar119 & auVar163) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_8a0._0_4_;
                  }
                  else {
                    local_8a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_8a0._4_4_ = 0;
                    local_8a0._8_4_ = 0;
                    local_8a0._12_4_ = 0;
                  }
                  *(undefined4 *)(local_640 + uVar91 * 4) = 0;
                  local_8a0._16_16_ = auVar120._16_16_;
                  auVar110._4_4_ = local_8a0._0_4_;
                  auVar110._0_4_ = local_8a0._0_4_;
                  auVar110._8_4_ = local_8a0._0_4_;
                  auVar110._12_4_ = local_8a0._0_4_;
                  auVar110._16_4_ = local_8a0._0_4_;
                  auVar110._20_4_ = local_8a0._0_4_;
                  auVar110._24_4_ = local_8a0._0_4_;
                  auVar110._28_4_ = local_8a0._0_4_;
                  auVar106 = vcmpps_avx(auVar181,auVar110,2);
                  auVar120 = vandps_avx(auVar106,local_640);
                  local_640 = local_640 & auVar106;
                  if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_640 >> 0x7f,0) == '\0') &&
                        (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_640 >> 0xbf,0) == '\0') &&
                      (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_640[0x1f]) break;
                  auVar133._8_4_ = 0x7f800000;
                  auVar133._0_8_ = 0x7f8000007f800000;
                  auVar133._12_4_ = 0x7f800000;
                  auVar133._16_4_ = 0x7f800000;
                  auVar133._20_4_ = 0x7f800000;
                  auVar133._24_4_ = 0x7f800000;
                  auVar133._28_4_ = 0x7f800000;
                  auVar181 = vblendvps_avx(auVar133,auVar181,auVar120);
                  auVar106 = vshufps_avx(auVar181,auVar181,0xb1);
                  auVar106 = vminps_avx(auVar181,auVar106);
                  auVar127 = vshufpd_avx(auVar106,auVar106,5);
                  auVar106 = vminps_avx(auVar106,auVar127);
                  auVar127 = vpermpd_avx2(auVar106,0x4e);
                  auVar106 = vminps_avx(auVar106,auVar127);
                  auVar106 = vcmpps_avx(auVar181,auVar106,0);
                  auVar127 = auVar120 & auVar106;
                  auVar181 = auVar120;
                  if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar127 >> 0x7f,0) != '\0') ||
                        (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar127 >> 0xbf,0) != '\0') ||
                      (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar127[0x1f] < '\0') {
                    auVar181 = vandps_avx(auVar106,auVar120);
                  }
                  uVar90 = vmovmskps_avx(auVar181);
                  uVar92 = 0;
                  for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                    uVar92 = uVar92 + 1;
                  }
                  uVar91 = (ulong)uVar92;
                  local_640 = auVar120;
                }
              }
            }
          }
          auVar134 = ZEXT3264(local_740);
          auVar159 = ZEXT3264(local_660);
        }
      }
      if (8 < iVar15) {
        uStack_6f8 = uVar209;
        local_700 = uVar97;
        uStack_6f0 = uVar210;
        uStack_6e8 = uVar211;
        local_3e0._4_4_ = iVar15;
        local_3e0._0_4_ = iVar15;
        local_3e0._8_4_ = iVar15;
        local_3e0._12_4_ = iVar15;
        local_3e0._16_4_ = iVar15;
        local_3e0._20_4_ = iVar15;
        local_3e0._24_4_ = iVar15;
        local_3e0._28_4_ = iVar15;
        local_400._4_4_ = fVar111;
        local_400._0_4_ = fVar111;
        fStack_3f8 = fVar111;
        fStack_3f4 = fVar111;
        fStack_3f0 = fVar111;
        fStack_3ec = fVar111;
        fStack_3e8 = fVar111;
        fStack_3e4 = fVar111;
        local_140 = local_800._0_4_;
        uStack_13c = local_800._0_4_;
        uStack_138 = local_800._0_4_;
        uStack_134 = local_800._0_4_;
        uStack_130 = local_800._0_4_;
        uStack_12c = local_800._0_4_;
        uStack_128 = local_800._0_4_;
        uStack_124 = local_800._0_4_;
        local_160 = 1.0 / (float)local_580._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_300 = uVar13;
        uStack_2fc = uVar13;
        uStack_2f8 = uVar13;
        uStack_2f4 = uVar13;
        local_310 = uVar14;
        uStack_30c = uVar14;
        uStack_308 = uVar14;
        uStack_304 = uVar14;
        lVar94 = 8;
        local_780 = auVar156;
        local_6e0 = auVar199;
        local_6c0 = auVar185;
        do {
          local_800 = *(undefined1 (*) [32])(bspline_basis0 + lVar94 * 4 + lVar24);
          auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21aefac + lVar94 * 4);
          auVar181 = *(undefined1 (*) [32])(lVar24 + 0x21af430 + lVar94 * 4);
          pfVar1 = (float *)(lVar24 + 0x21af8b4 + lVar94 * 4);
          local_3a0 = *pfVar1;
          fStack_39c = pfVar1[1];
          fStack_398 = pfVar1[2];
          fStack_394 = pfVar1[3];
          fStack_390 = pfVar1[4];
          fStack_38c = pfVar1[5];
          fStack_388 = pfVar1[6];
          auVar226._0_4_ = local_520 * local_3a0;
          auVar226._4_4_ = fStack_51c * fStack_39c;
          auVar226._8_4_ = fStack_518 * fStack_398;
          auVar226._12_4_ = fStack_514 * fStack_394;
          auVar226._16_4_ = fStack_510 * fStack_390;
          auVar226._20_4_ = fStack_50c * fStack_38c;
          auVar226._28_36_ = auVar179._28_36_;
          auVar226._24_4_ = fStack_508 * fStack_388;
          auVar195._0_4_ = (float)local_500 * local_3a0;
          auVar195._4_4_ = local_500._4_4_ * fStack_39c;
          auVar195._8_4_ = (float)uStack_4f8 * fStack_398;
          auVar195._12_4_ = uStack_4f8._4_4_ * fStack_394;
          auVar195._16_4_ = (float)uStack_4f0 * fStack_390;
          auVar195._20_4_ = uStack_4f0._4_4_ * fStack_38c;
          auVar195._28_36_ = auVar194._28_36_;
          auVar195._24_4_ = (float)uStack_4e8 * fStack_388;
          auVar163 = vfmadd231ps_fma(auVar226._0_32_,auVar181,auVar134._0_32_);
          auVar166 = vfmadd231ps_fma(auVar195._0_32_,auVar181,auVar159._0_32_);
          auVar108 = auVar225._0_32_;
          auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar120,auVar108);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar120,local_560);
          auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),local_800,auVar203._0_32_);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),local_800,local_540);
          auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar94 * 4 + lVar24);
          auVar127 = *(undefined1 (*) [32])(lVar24 + 0x21b13cc + lVar94 * 4);
          auVar149 = *(undefined1 (*) [32])(lVar24 + 0x21b1850 + lVar94 * 4);
          pfVar2 = (float *)(lVar24 + 0x21b1cd4 + lVar94 * 4);
          fVar117 = *pfVar2;
          fVar186 = pfVar2[1];
          fVar87 = pfVar2[2];
          fVar204 = pfVar2[3];
          fVar208 = pfVar2[4];
          fVar220 = pfVar2[5];
          fVar221 = pfVar2[6];
          auVar194._0_4_ = fVar117 * local_520;
          auVar194._4_4_ = fVar186 * fStack_51c;
          auVar194._8_4_ = fVar87 * fStack_518;
          auVar194._12_4_ = fVar204 * fStack_514;
          auVar194._16_4_ = fVar208 * fStack_510;
          auVar194._20_4_ = fVar220 * fStack_50c;
          auVar194._28_36_ = auVar203._28_36_;
          auVar194._24_4_ = fVar221 * fStack_508;
          auVar56._4_4_ = fVar186 * local_500._4_4_;
          auVar56._0_4_ = fVar117 * (float)local_500;
          auVar56._8_4_ = fVar87 * (float)uStack_4f8;
          auVar56._12_4_ = fVar204 * uStack_4f8._4_4_;
          auVar56._16_4_ = fVar208 * (float)uStack_4f0;
          auVar56._20_4_ = fVar220 * uStack_4f0._4_4_;
          auVar56._24_4_ = fVar221 * (float)uStack_4e8;
          auVar56._28_4_ = uStack_4e8._4_4_;
          auVar5 = vfmadd231ps_fma(auVar194._0_32_,auVar149,auVar134._0_32_);
          auVar6 = vfmadd231ps_fma(auVar56,auVar149,auVar159._0_32_);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,auVar108);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar127,local_560);
          auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar106,auVar203._0_32_);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar106,local_540);
          local_6a0 = ZEXT1632(auVar5);
          local_380 = ZEXT1632(auVar163);
          local_5a0 = vsubps_avx(local_6a0,local_380);
          local_680 = ZEXT1632(auVar6);
          local_340 = ZEXT1632(auVar166);
          local_360 = vsubps_avx(local_680,local_340);
          auVar84._4_4_ = auVar166._4_4_ * local_5a0._4_4_;
          auVar84._0_4_ = auVar166._0_4_ * local_5a0._0_4_;
          auVar84._8_4_ = auVar166._8_4_ * local_5a0._8_4_;
          auVar84._12_4_ = auVar166._12_4_ * local_5a0._12_4_;
          auVar84._16_4_ = local_5a0._16_4_ * 0.0;
          auVar84._20_4_ = local_5a0._20_4_ * 0.0;
          auVar84._24_4_ = local_5a0._24_4_ * 0.0;
          auVar84._28_4_ = local_560._28_4_;
          auVar194 = ZEXT3264(auVar181);
          fVar135 = local_360._0_4_;
          auVar159._0_4_ = auVar163._0_4_ * fVar135;
          fVar111 = local_360._4_4_;
          auVar159._4_4_ = auVar163._4_4_ * fVar111;
          fVar112 = local_360._8_4_;
          auVar159._8_4_ = auVar163._8_4_ * fVar112;
          fVar113 = local_360._12_4_;
          auVar159._12_4_ = auVar163._12_4_ * fVar113;
          fVar114 = local_360._16_4_;
          auVar159._16_4_ = fVar114 * 0.0;
          fVar115 = local_360._20_4_;
          auVar159._20_4_ = fVar115 * 0.0;
          fVar116 = local_360._24_4_;
          auVar159._28_36_ = auVar134._28_36_;
          auVar159._24_4_ = fVar116 * 0.0;
          auVar191 = vsubps_avx(auVar84,auVar159._0_32_);
          fStack_384 = pfVar1[7];
          auVar175._0_4_ = (float)local_100 * local_3a0;
          auVar175._4_4_ = local_100._4_4_ * fStack_39c;
          auVar175._8_4_ = (float)uStack_f8 * fStack_398;
          auVar175._12_4_ = uStack_f8._4_4_ * fStack_394;
          auVar175._16_4_ = (float)uStack_f0 * fStack_390;
          auVar175._20_4_ = uStack_f0._4_4_ * fStack_38c;
          auVar175._24_4_ = (float)uStack_e8 * fStack_388;
          auVar175._28_4_ = 0;
          auVar163 = vfmadd231ps_fma(auVar175,auVar181,local_e0);
          auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),local_c0,auVar120);
          auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),local_a0,local_800);
          auVar179 = ZEXT1664(auVar163);
          auVar57._4_4_ = fVar186 * local_100._4_4_;
          auVar57._0_4_ = fVar117 * (float)local_100;
          auVar57._8_4_ = fVar87 * (float)uStack_f8;
          auVar57._12_4_ = fVar204 * uStack_f8._4_4_;
          auVar57._16_4_ = fVar208 * (float)uStack_f0;
          auVar57._20_4_ = fVar220 * uStack_f0._4_4_;
          auVar57._24_4_ = fVar221 * (float)uStack_e8;
          auVar57._28_4_ = uStack_e8._4_4_;
          auVar166 = vfmadd231ps_fma(auVar57,auVar149,local_e0);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar127,local_c0);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar106,local_a0);
          auVar226 = ZEXT3264(auVar108);
          auVar85._4_4_ = fVar111 * fVar111;
          auVar85._0_4_ = fVar135 * fVar135;
          auVar85._8_4_ = fVar112 * fVar112;
          auVar85._12_4_ = fVar113 * fVar113;
          auVar85._16_4_ = fVar114 * fVar114;
          auVar85._20_4_ = fVar115 * fVar115;
          auVar85._24_4_ = fVar116 * fVar116;
          auVar85._28_4_ = local_540._28_4_;
          auVar5 = vfmadd231ps_fma(auVar85,local_5a0,local_5a0);
          local_3c0 = ZEXT1632(auVar166);
          auVar23 = vmaxps_avx(ZEXT1632(auVar163),local_3c0);
          auVar197._0_4_ = auVar23._0_4_ * auVar23._0_4_ * auVar5._0_4_;
          auVar197._4_4_ = auVar23._4_4_ * auVar23._4_4_ * auVar5._4_4_;
          auVar197._8_4_ = auVar23._8_4_ * auVar23._8_4_ * auVar5._8_4_;
          auVar197._12_4_ = auVar23._12_4_ * auVar23._12_4_ * auVar5._12_4_;
          auVar197._16_4_ = auVar23._16_4_ * auVar23._16_4_ * 0.0;
          auVar197._20_4_ = auVar23._20_4_ * auVar23._20_4_ * 0.0;
          auVar197._24_4_ = auVar23._24_4_ * auVar23._24_4_ * 0.0;
          auVar197._28_4_ = 0;
          auVar58._4_4_ = auVar191._4_4_ * auVar191._4_4_;
          auVar58._0_4_ = auVar191._0_4_ * auVar191._0_4_;
          auVar58._8_4_ = auVar191._8_4_ * auVar191._8_4_;
          auVar58._12_4_ = auVar191._12_4_ * auVar191._12_4_;
          auVar58._16_4_ = auVar191._16_4_ * auVar191._16_4_;
          auVar58._20_4_ = auVar191._20_4_ * auVar191._20_4_;
          auVar58._24_4_ = auVar191._24_4_ * auVar191._24_4_;
          auVar58._28_4_ = auVar191._28_4_;
          auVar23 = vcmpps_avx(auVar58,auVar197,2);
          local_280 = (int)lVar94;
          auVar198._4_4_ = local_280;
          auVar198._0_4_ = local_280;
          auVar198._8_4_ = local_280;
          auVar198._12_4_ = local_280;
          auVar198._16_4_ = local_280;
          auVar198._20_4_ = local_280;
          auVar198._24_4_ = local_280;
          auVar198._28_4_ = local_280;
          auVar191 = vpor_avx2(auVar198,_DAT_01fe9900);
          auVar21 = vpcmpgtd_avx2(local_3e0,auVar191);
          auVar191 = auVar21 & auVar23;
          if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar191 >> 0x7f,0) == '\0') &&
                (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar191 >> 0xbf,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar191[0x1f]) {
            auVar203 = ZEXT3264(local_7e0);
          }
          else {
            local_580 = vandps_avx(auVar21,auVar23);
            auVar59._4_4_ = local_700._4_4_ * fVar186;
            auVar59._0_4_ = (float)local_700 * fVar117;
            auVar59._8_4_ = (float)uStack_6f8 * fVar87;
            auVar59._12_4_ = uStack_6f8._4_4_ * fVar204;
            auVar59._16_4_ = (float)uStack_6f0 * fVar208;
            auVar59._20_4_ = uStack_6f0._4_4_ * fVar220;
            auVar59._24_4_ = (float)uStack_6e8 * fVar221;
            auVar59._28_4_ = auVar23._28_4_;
            auVar166 = vfmadd213ps_fma(auVar149,local_6e0,auVar59);
            auVar166 = vfmadd213ps_fma(auVar127,local_6c0,ZEXT1632(auVar166));
            auVar166 = vfmadd132ps_fma(auVar106,ZEXT1632(auVar166),local_780);
            auVar60._4_4_ = local_700._4_4_ * fStack_39c;
            auVar60._0_4_ = (float)local_700 * local_3a0;
            auVar60._8_4_ = (float)uStack_6f8 * fStack_398;
            auVar60._12_4_ = uStack_6f8._4_4_ * fStack_394;
            auVar60._16_4_ = (float)uStack_6f0 * fStack_390;
            auVar60._20_4_ = uStack_6f0._4_4_ * fStack_38c;
            auVar60._24_4_ = (float)uStack_6e8 * fStack_388;
            auVar60._28_4_ = auVar23._28_4_;
            auVar5 = vfmadd213ps_fma(auVar181,local_6e0,auVar60);
            auVar5 = vfmadd213ps_fma(auVar120,local_6c0,ZEXT1632(auVar5));
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21afd38 + lVar94 * 4);
            auVar181 = *(undefined1 (*) [32])(lVar24 + 0x21b01bc + lVar94 * 4);
            auVar106 = *(undefined1 (*) [32])(lVar24 + 0x21b0640 + lVar94 * 4);
            pfVar1 = (float *)(lVar24 + 0x21b0ac4 + lVar94 * 4);
            fVar135 = *pfVar1;
            fVar111 = pfVar1[1];
            fVar112 = pfVar1[2];
            fVar113 = pfVar1[3];
            fVar114 = pfVar1[4];
            fVar115 = pfVar1[5];
            fVar116 = pfVar1[6];
            auVar192._0_4_ = local_520 * fVar135;
            auVar192._4_4_ = fStack_51c * fVar111;
            auVar192._8_4_ = fStack_518 * fVar112;
            auVar192._12_4_ = fStack_514 * fVar113;
            auVar192._16_4_ = fStack_510 * fVar114;
            auVar192._20_4_ = fStack_50c * fVar115;
            auVar192._24_4_ = fStack_508 * fVar116;
            auVar192._28_4_ = 0;
            auVar206._0_4_ = fVar135 * (float)local_500;
            auVar206._4_4_ = fVar111 * local_500._4_4_;
            auVar206._8_4_ = fVar112 * (float)uStack_4f8;
            auVar206._12_4_ = fVar113 * uStack_4f8._4_4_;
            auVar206._16_4_ = fVar114 * (float)uStack_4f0;
            auVar206._20_4_ = fVar115 * uStack_4f0._4_4_;
            auVar206._24_4_ = fVar116 * (float)uStack_4e8;
            auVar206._28_4_ = 0;
            auVar61._4_4_ = fVar111 * local_700._4_4_;
            auVar61._0_4_ = fVar135 * (float)local_700;
            auVar61._8_4_ = fVar112 * (float)uStack_6f8;
            auVar61._12_4_ = fVar113 * uStack_6f8._4_4_;
            auVar61._16_4_ = fVar114 * (float)uStack_6f0;
            auVar61._20_4_ = fVar115 * uStack_6f0._4_4_;
            auVar61._24_4_ = fVar116 * (float)uStack_6e8;
            auVar61._28_4_ = pfVar1[7];
            auVar6 = vfmadd231ps_fma(auVar192,auVar106,local_740);
            auVar7 = vfmadd231ps_fma(auVar206,auVar106,local_660);
            auVar11 = vfmadd231ps_fma(auVar61,local_6e0,auVar106);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar181,auVar108);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar181,local_560);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_6c0,auVar181);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar120,local_7e0);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar120,local_540);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_780,auVar120);
            pfVar1 = (float *)(lVar24 + 0x21b2ee4 + lVar94 * 4);
            fVar135 = *pfVar1;
            fVar111 = pfVar1[1];
            fVar112 = pfVar1[2];
            fVar113 = pfVar1[3];
            fVar114 = pfVar1[4];
            fVar115 = pfVar1[5];
            fVar116 = pfVar1[6];
            auVar62._4_4_ = fStack_51c * fVar111;
            auVar62._0_4_ = local_520 * fVar135;
            auVar62._8_4_ = fStack_518 * fVar112;
            auVar62._12_4_ = fStack_514 * fVar113;
            auVar62._16_4_ = fStack_510 * fVar114;
            auVar62._20_4_ = fStack_50c * fVar115;
            auVar62._24_4_ = fStack_508 * fVar116;
            auVar62._28_4_ = fStack_504;
            auVar63._4_4_ = local_500._4_4_ * fVar111;
            auVar63._0_4_ = (float)local_500 * fVar135;
            auVar63._8_4_ = (float)uStack_4f8 * fVar112;
            auVar63._12_4_ = uStack_4f8._4_4_ * fVar113;
            auVar63._16_4_ = (float)uStack_4f0 * fVar114;
            auVar63._20_4_ = uStack_4f0._4_4_ * fVar115;
            auVar63._24_4_ = (float)uStack_4e8 * fVar116;
            auVar63._28_4_ = auVar225._28_4_;
            auVar64._4_4_ = local_700._4_4_ * fVar111;
            auVar64._0_4_ = (float)local_700 * fVar135;
            auVar64._8_4_ = (float)uStack_6f8 * fVar112;
            auVar64._12_4_ = uStack_6f8._4_4_ * fVar113;
            auVar64._16_4_ = (float)uStack_6f0 * fVar114;
            auVar64._20_4_ = uStack_6f0._4_4_ * fVar115;
            auVar64._24_4_ = (float)uStack_6e8 * fVar116;
            auVar64._28_4_ = pfVar1[7];
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21b2a60 + lVar94 * 4);
            auVar98 = vfmadd231ps_fma(auVar62,auVar120,local_740);
            auVar136 = vfmadd231ps_fma(auVar63,auVar120,local_660);
            auVar99 = vfmadd231ps_fma(auVar64,auVar120,local_6e0);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21b25dc + lVar94 * 4);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar120,local_720);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar120,local_560);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar120,local_6c0);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21b2158 + lVar94 * 4);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar120,local_7e0);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar120,local_540);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_780,auVar120);
            auVar120 = vandps_avx(ZEXT1632(auVar6),local_1a0);
            auVar181 = vandps_avx(ZEXT1632(auVar7),local_1a0);
            auVar181 = vmaxps_avx(auVar120,auVar181);
            auVar120 = vandps_avx(ZEXT1632(auVar11),local_1a0);
            auVar120 = vmaxps_avx(auVar181,auVar120);
            auVar120 = vcmpps_avx(auVar120,_local_400,1);
            auVar106 = vblendvps_avx(ZEXT1632(auVar6),local_5a0,auVar120);
            auVar127 = vblendvps_avx(ZEXT1632(auVar7),local_360,auVar120);
            auVar120 = vandps_avx(ZEXT1632(auVar98),local_1a0);
            auVar181 = vandps_avx(ZEXT1632(auVar136),local_1a0);
            auVar181 = vmaxps_avx(auVar120,auVar181);
            auVar120 = vandps_avx(local_1a0,ZEXT1632(auVar99));
            auVar120 = vmaxps_avx(auVar181,auVar120);
            auVar181 = vcmpps_avx(auVar120,_local_400,1);
            auVar120 = vblendvps_avx(ZEXT1632(auVar98),local_5a0,auVar181);
            auVar181 = vblendvps_avx(ZEXT1632(auVar136),local_360,auVar181);
            auVar5 = vfmadd213ps_fma(local_800,local_780,ZEXT1632(auVar5));
            auVar6 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar127,auVar127);
            auVar149 = vrsqrtps_avx(ZEXT1632(auVar6));
            fVar135 = auVar149._0_4_;
            fVar111 = auVar149._4_4_;
            fVar112 = auVar149._8_4_;
            fVar113 = auVar149._12_4_;
            fVar114 = auVar149._16_4_;
            fVar115 = auVar149._20_4_;
            fVar116 = auVar149._24_4_;
            auVar65._4_4_ = fVar111 * fVar111 * fVar111 * auVar6._4_4_ * -0.5;
            auVar65._0_4_ = fVar135 * fVar135 * fVar135 * auVar6._0_4_ * -0.5;
            auVar65._8_4_ = fVar112 * fVar112 * fVar112 * auVar6._8_4_ * -0.5;
            auVar65._12_4_ = fVar113 * fVar113 * fVar113 * auVar6._12_4_ * -0.5;
            auVar65._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar65._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar65._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar65._28_4_ = 0;
            auVar217._8_4_ = 0x3fc00000;
            auVar217._0_8_ = 0x3fc000003fc00000;
            auVar217._12_4_ = 0x3fc00000;
            auVar217._16_4_ = 0x3fc00000;
            auVar217._20_4_ = 0x3fc00000;
            auVar217._24_4_ = 0x3fc00000;
            auVar217._28_4_ = 0x3fc00000;
            auVar6 = vfmadd231ps_fma(auVar65,auVar217,auVar149);
            fVar135 = auVar6._0_4_;
            fVar111 = auVar6._4_4_;
            auVar66._4_4_ = auVar127._4_4_ * fVar111;
            auVar66._0_4_ = auVar127._0_4_ * fVar135;
            fVar112 = auVar6._8_4_;
            auVar66._8_4_ = auVar127._8_4_ * fVar112;
            fVar113 = auVar6._12_4_;
            auVar66._12_4_ = auVar127._12_4_ * fVar113;
            auVar66._16_4_ = auVar127._16_4_ * 0.0;
            auVar66._20_4_ = auVar127._20_4_ * 0.0;
            auVar66._24_4_ = auVar127._24_4_ * 0.0;
            auVar66._28_4_ = auVar127._28_4_;
            auVar67._4_4_ = fVar111 * -auVar106._4_4_;
            auVar67._0_4_ = fVar135 * -auVar106._0_4_;
            auVar67._8_4_ = fVar112 * -auVar106._8_4_;
            auVar67._12_4_ = fVar113 * -auVar106._12_4_;
            auVar67._16_4_ = -auVar106._16_4_ * 0.0;
            auVar67._20_4_ = -auVar106._20_4_ * 0.0;
            auVar67._24_4_ = -auVar106._24_4_ * 0.0;
            auVar67._28_4_ = auVar149._28_4_;
            auVar6 = vfmadd213ps_fma(auVar120,auVar120,ZEXT832(0) << 0x20);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar181,auVar181);
            auVar106 = vrsqrtps_avx(ZEXT1632(auVar6));
            auVar68._28_4_ = local_360._28_4_;
            auVar68._0_28_ =
                 ZEXT1628(CONCAT412(fVar113 * 0.0,
                                    CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar135 * 0.0))));
            fVar135 = auVar106._0_4_;
            fVar111 = auVar106._4_4_;
            fVar112 = auVar106._8_4_;
            fVar113 = auVar106._12_4_;
            fVar114 = auVar106._16_4_;
            fVar115 = auVar106._20_4_;
            fVar116 = auVar106._24_4_;
            auVar69._4_4_ = fVar111 * fVar111 * fVar111 * auVar6._4_4_ * -0.5;
            auVar69._0_4_ = fVar135 * fVar135 * fVar135 * auVar6._0_4_ * -0.5;
            auVar69._8_4_ = fVar112 * fVar112 * fVar112 * auVar6._8_4_ * -0.5;
            auVar69._12_4_ = fVar113 * fVar113 * fVar113 * auVar6._12_4_ * -0.5;
            auVar69._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar69._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar69._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
            auVar69._28_4_ = 0;
            auVar6 = vfmadd231ps_fma(auVar69,auVar217,auVar106);
            fVar135 = auVar6._0_4_;
            fVar111 = auVar6._4_4_;
            auVar70._4_4_ = auVar181._4_4_ * fVar111;
            auVar70._0_4_ = auVar181._0_4_ * fVar135;
            fVar112 = auVar6._8_4_;
            auVar70._8_4_ = auVar181._8_4_ * fVar112;
            fVar113 = auVar6._12_4_;
            auVar70._12_4_ = auVar181._12_4_ * fVar113;
            auVar70._16_4_ = auVar181._16_4_ * 0.0;
            auVar70._20_4_ = auVar181._20_4_ * 0.0;
            auVar70._24_4_ = auVar181._24_4_ * 0.0;
            auVar70._28_4_ = 0;
            auVar71._4_4_ = fVar111 * -auVar120._4_4_;
            auVar71._0_4_ = fVar135 * -auVar120._0_4_;
            auVar71._8_4_ = fVar112 * -auVar120._8_4_;
            auVar71._12_4_ = fVar113 * -auVar120._12_4_;
            auVar71._16_4_ = -auVar120._16_4_ * 0.0;
            auVar71._20_4_ = -auVar120._20_4_ * 0.0;
            auVar71._24_4_ = -auVar120._24_4_ * 0.0;
            auVar71._28_4_ = auVar106._28_4_;
            auVar72._28_4_ = 0xbf000000;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar113 * 0.0,
                                    CONCAT48(fVar112 * 0.0,CONCAT44(fVar111 * 0.0,fVar135 * 0.0))));
            auVar6 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar163),local_380);
            auVar120 = ZEXT1632(auVar163);
            auVar7 = vfmadd213ps_fma(auVar67,auVar120,local_340);
            auVar11 = vfmadd213ps_fma(auVar68,auVar120,ZEXT1632(auVar5));
            auVar99 = vfnmadd213ps_fma(auVar66,auVar120,local_380);
            auVar98 = vfmadd213ps_fma(auVar70,local_3c0,local_6a0);
            auVar137 = vfnmadd213ps_fma(auVar67,auVar120,local_340);
            auVar136 = vfmadd213ps_fma(auVar71,local_3c0,local_680);
            auVar155 = ZEXT1632(auVar163);
            auVar163 = vfnmadd231ps_fma(ZEXT1632(auVar5),auVar155,auVar68);
            auVar5 = vfmadd213ps_fma(auVar72,local_3c0,ZEXT1632(auVar166));
            auVar25 = vfnmadd213ps_fma(auVar70,local_3c0,local_6a0);
            auVar138 = vfnmadd213ps_fma(auVar71,local_3c0,local_680);
            auVar153 = vfnmadd231ps_fma(ZEXT1632(auVar166),local_3c0,auVar72);
            auVar120 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar137));
            auVar181 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar163));
            auVar73._4_4_ = auVar120._4_4_ * auVar163._4_4_;
            auVar73._0_4_ = auVar120._0_4_ * auVar163._0_4_;
            auVar73._8_4_ = auVar120._8_4_ * auVar163._8_4_;
            auVar73._12_4_ = auVar120._12_4_ * auVar163._12_4_;
            auVar73._16_4_ = auVar120._16_4_ * 0.0;
            auVar73._20_4_ = auVar120._20_4_ * 0.0;
            auVar73._24_4_ = auVar120._24_4_ * 0.0;
            auVar73._28_4_ = local_360._28_4_;
            auVar166 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar137),auVar181);
            auVar74._4_4_ = auVar99._4_4_ * auVar181._4_4_;
            auVar74._0_4_ = auVar99._0_4_ * auVar181._0_4_;
            auVar74._8_4_ = auVar99._8_4_ * auVar181._8_4_;
            auVar74._12_4_ = auVar99._12_4_ * auVar181._12_4_;
            auVar74._16_4_ = auVar181._16_4_ * 0.0;
            auVar74._20_4_ = auVar181._20_4_ * 0.0;
            auVar74._24_4_ = auVar181._24_4_ * 0.0;
            auVar74._28_4_ = auVar181._28_4_;
            auVar191 = ZEXT1632(auVar99);
            auVar181 = vsubps_avx(ZEXT1632(auVar98),auVar191);
            auVar108 = ZEXT1632(auVar163);
            auVar163 = vfmsub231ps_fma(auVar74,auVar108,auVar181);
            auVar75._4_4_ = auVar137._4_4_ * auVar181._4_4_;
            auVar75._0_4_ = auVar137._0_4_ * auVar181._0_4_;
            auVar75._8_4_ = auVar137._8_4_ * auVar181._8_4_;
            auVar75._12_4_ = auVar137._12_4_ * auVar181._12_4_;
            auVar75._16_4_ = auVar181._16_4_ * 0.0;
            auVar75._20_4_ = auVar181._20_4_ * 0.0;
            auVar75._24_4_ = auVar181._24_4_ * 0.0;
            auVar75._28_4_ = auVar181._28_4_;
            auVar99 = vfmsub231ps_fma(auVar75,auVar191,auVar120);
            auVar163 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT832(0) << 0x20,ZEXT1632(auVar163));
            auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
            auVar100 = vcmpps_avx(ZEXT1632(auVar163),ZEXT832(0) << 0x20,2);
            auVar120 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar6),auVar100);
            auVar181 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar7),auVar100);
            auVar106 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar11),auVar100);
            auVar127 = vblendvps_avx(auVar191,ZEXT1632(auVar98),auVar100);
            auVar149 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar136),auVar100);
            auVar23 = vblendvps_avx(auVar108,ZEXT1632(auVar5),auVar100);
            auVar191 = vblendvps_avx(ZEXT1632(auVar98),auVar191,auVar100);
            auVar21 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar137),auVar100);
            auVar163 = vpackssdw_avx(local_580._0_16_,local_580._16_16_);
            local_800 = ZEXT1632(auVar163);
            auVar108 = vblendvps_avx(ZEXT1632(auVar5),auVar108,auVar100);
            auVar191 = vsubps_avx(auVar191,auVar120);
            auVar21 = vsubps_avx(auVar21,auVar181);
            auVar122 = vsubps_avx(auVar108,auVar106);
            auVar224 = vsubps_avx(auVar120,auVar127);
            auVar147 = vsubps_avx(auVar181,auVar149);
            auVar148 = vsubps_avx(auVar106,auVar23);
            auVar176._0_4_ = auVar122._0_4_ * auVar120._0_4_;
            auVar176._4_4_ = auVar122._4_4_ * auVar120._4_4_;
            auVar176._8_4_ = auVar122._8_4_ * auVar120._8_4_;
            auVar176._12_4_ = auVar122._12_4_ * auVar120._12_4_;
            auVar176._16_4_ = auVar122._16_4_ * auVar120._16_4_;
            auVar176._20_4_ = auVar122._20_4_ * auVar120._20_4_;
            auVar176._24_4_ = auVar122._24_4_ * auVar120._24_4_;
            auVar176._28_4_ = 0;
            auVar166 = vfmsub231ps_fma(auVar176,auVar106,auVar191);
            auVar76._4_4_ = auVar191._4_4_ * auVar181._4_4_;
            auVar76._0_4_ = auVar191._0_4_ * auVar181._0_4_;
            auVar76._8_4_ = auVar191._8_4_ * auVar181._8_4_;
            auVar76._12_4_ = auVar191._12_4_ * auVar181._12_4_;
            auVar76._16_4_ = auVar191._16_4_ * auVar181._16_4_;
            auVar76._20_4_ = auVar191._20_4_ * auVar181._20_4_;
            auVar76._24_4_ = auVar191._24_4_ * auVar181._24_4_;
            auVar76._28_4_ = auVar108._28_4_;
            auVar5 = vfmsub231ps_fma(auVar76,auVar120,auVar21);
            auVar166 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
            auVar177._0_4_ = auVar21._0_4_ * auVar106._0_4_;
            auVar177._4_4_ = auVar21._4_4_ * auVar106._4_4_;
            auVar177._8_4_ = auVar21._8_4_ * auVar106._8_4_;
            auVar177._12_4_ = auVar21._12_4_ * auVar106._12_4_;
            auVar177._16_4_ = auVar21._16_4_ * auVar106._16_4_;
            auVar177._20_4_ = auVar21._20_4_ * auVar106._20_4_;
            auVar177._24_4_ = auVar21._24_4_ * auVar106._24_4_;
            auVar177._28_4_ = 0;
            auVar5 = vfmsub231ps_fma(auVar177,auVar181,auVar122);
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar5));
            auVar178._0_4_ = auVar148._0_4_ * auVar127._0_4_;
            auVar178._4_4_ = auVar148._4_4_ * auVar127._4_4_;
            auVar178._8_4_ = auVar148._8_4_ * auVar127._8_4_;
            auVar178._12_4_ = auVar148._12_4_ * auVar127._12_4_;
            auVar178._16_4_ = auVar148._16_4_ * auVar127._16_4_;
            auVar178._20_4_ = auVar148._20_4_ * auVar127._20_4_;
            auVar178._24_4_ = auVar148._24_4_ * auVar127._24_4_;
            auVar178._28_4_ = 0;
            auVar166 = vfmsub231ps_fma(auVar178,auVar224,auVar23);
            auVar77._4_4_ = auVar147._4_4_ * auVar23._4_4_;
            auVar77._0_4_ = auVar147._0_4_ * auVar23._0_4_;
            auVar77._8_4_ = auVar147._8_4_ * auVar23._8_4_;
            auVar77._12_4_ = auVar147._12_4_ * auVar23._12_4_;
            auVar77._16_4_ = auVar147._16_4_ * auVar23._16_4_;
            auVar77._20_4_ = auVar147._20_4_ * auVar23._20_4_;
            auVar77._24_4_ = auVar147._24_4_ * auVar23._24_4_;
            auVar77._28_4_ = auVar23._28_4_;
            auVar6 = vfmsub231ps_fma(auVar77,auVar149,auVar148);
            auVar78._4_4_ = auVar224._4_4_ * auVar149._4_4_;
            auVar78._0_4_ = auVar224._0_4_ * auVar149._0_4_;
            auVar78._8_4_ = auVar224._8_4_ * auVar149._8_4_;
            auVar78._12_4_ = auVar224._12_4_ * auVar149._12_4_;
            auVar78._16_4_ = auVar224._16_4_ * auVar149._16_4_;
            auVar78._20_4_ = auVar224._20_4_ * auVar149._20_4_;
            auVar78._24_4_ = auVar224._24_4_ * auVar149._24_4_;
            auVar78._28_4_ = auVar149._28_4_;
            auVar7 = vfmsub231ps_fma(auVar78,auVar147,auVar127);
            auVar166 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
            auVar127 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
            auVar194 = ZEXT864(0) << 0x20;
            auVar127 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,2);
            auVar166 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
            auVar163 = vpand_avx(auVar166,auVar163);
            auVar127 = vpmovsxwd_avx2(auVar163);
            auVar179 = ZEXT3264(auVar127);
            if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar127 >> 0x7f,0) == '\0') &&
                  (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar127 >> 0xbf,0) == '\0') &&
                (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar127[0x1f]) {
LAB_018ab046:
              auVar158._8_8_ = uStack_5f8;
              auVar158._0_8_ = local_600;
              auVar158._16_8_ = uStack_5f0;
              auVar158._24_8_ = uStack_5e8;
            }
            else {
              auVar79._4_4_ = auVar21._4_4_ * auVar148._4_4_;
              auVar79._0_4_ = auVar21._0_4_ * auVar148._0_4_;
              auVar79._8_4_ = auVar21._8_4_ * auVar148._8_4_;
              auVar79._12_4_ = auVar21._12_4_ * auVar148._12_4_;
              auVar79._16_4_ = auVar21._16_4_ * auVar148._16_4_;
              auVar79._20_4_ = auVar21._20_4_ * auVar148._20_4_;
              auVar79._24_4_ = auVar21._24_4_ * auVar148._24_4_;
              auVar79._28_4_ = auVar127._28_4_;
              auVar98 = vfmsub231ps_fma(auVar79,auVar147,auVar122);
              auVar182._0_4_ = auVar224._0_4_ * auVar122._0_4_;
              auVar182._4_4_ = auVar224._4_4_ * auVar122._4_4_;
              auVar182._8_4_ = auVar224._8_4_ * auVar122._8_4_;
              auVar182._12_4_ = auVar224._12_4_ * auVar122._12_4_;
              auVar182._16_4_ = auVar224._16_4_ * auVar122._16_4_;
              auVar182._20_4_ = auVar224._20_4_ * auVar122._20_4_;
              auVar182._24_4_ = auVar224._24_4_ * auVar122._24_4_;
              auVar182._28_4_ = 0;
              auVar11 = vfmsub231ps_fma(auVar182,auVar191,auVar148);
              auVar80._4_4_ = auVar191._4_4_ * auVar147._4_4_;
              auVar80._0_4_ = auVar191._0_4_ * auVar147._0_4_;
              auVar80._8_4_ = auVar191._8_4_ * auVar147._8_4_;
              auVar80._12_4_ = auVar191._12_4_ * auVar147._12_4_;
              auVar80._16_4_ = auVar191._16_4_ * auVar147._16_4_;
              auVar80._20_4_ = auVar191._20_4_ * auVar147._20_4_;
              auVar80._24_4_ = auVar191._24_4_ * auVar147._24_4_;
              auVar80._28_4_ = auVar147._28_4_;
              auVar136 = vfmsub231ps_fma(auVar80,auVar224,auVar21);
              auVar166 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar11),ZEXT1632(auVar136));
              auVar7 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT1632(auVar98),ZEXT832(0) << 0x20);
              auVar127 = vrcpps_avx(ZEXT1632(auVar7));
              auVar207._8_4_ = 0x3f800000;
              auVar207._0_8_ = 0x3f8000003f800000;
              auVar207._12_4_ = 0x3f800000;
              auVar207._16_4_ = 0x3f800000;
              auVar207._20_4_ = 0x3f800000;
              auVar207._24_4_ = 0x3f800000;
              auVar207._28_4_ = 0x3f800000;
              auVar166 = vfnmadd213ps_fma(auVar127,ZEXT1632(auVar7),auVar207);
              auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar127,auVar127);
              auVar194 = ZEXT1664(auVar166);
              auVar81._4_4_ = auVar136._4_4_ * auVar106._4_4_;
              auVar81._0_4_ = auVar136._0_4_ * auVar106._0_4_;
              auVar81._8_4_ = auVar136._8_4_ * auVar106._8_4_;
              auVar81._12_4_ = auVar136._12_4_ * auVar106._12_4_;
              auVar81._16_4_ = auVar106._16_4_ * 0.0;
              auVar81._20_4_ = auVar106._20_4_ * 0.0;
              auVar81._24_4_ = auVar106._24_4_ * 0.0;
              auVar81._28_4_ = auVar106._28_4_;
              auVar11 = vfmadd231ps_fma(auVar81,ZEXT1632(auVar11),auVar181);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar98),auVar120);
              fVar135 = auVar166._0_4_;
              fVar111 = auVar166._4_4_;
              fVar112 = auVar166._8_4_;
              fVar113 = auVar166._12_4_;
              auVar106 = ZEXT1632(CONCAT412(fVar113 * auVar11._12_4_,
                                            CONCAT48(fVar112 * auVar11._8_4_,
                                                     CONCAT44(fVar111 * auVar11._4_4_,
                                                              fVar135 * auVar11._0_4_))));
              auVar179 = ZEXT3264(auVar106);
              uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar157._4_4_ = uVar96;
              auVar157._0_4_ = uVar96;
              auVar157._8_4_ = uVar96;
              auVar157._12_4_ = uVar96;
              auVar157._16_4_ = uVar96;
              auVar157._20_4_ = uVar96;
              auVar157._24_4_ = uVar96;
              auVar157._28_4_ = uVar96;
              auVar88._4_4_ = uStack_13c;
              auVar88._0_4_ = local_140;
              auVar88._8_4_ = uStack_138;
              auVar88._12_4_ = uStack_134;
              auVar88._16_4_ = uStack_130;
              auVar88._20_4_ = uStack_12c;
              auVar88._24_4_ = uStack_128;
              auVar88._28_4_ = uStack_124;
              auVar120 = vcmpps_avx(auVar88,auVar106,2);
              auVar181 = vcmpps_avx(auVar106,auVar157,2);
              auVar120 = vandps_avx(auVar181,auVar120);
              auVar166 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
              auVar163 = vpand_avx(auVar163,auVar166);
              auVar120 = vpmovsxwd_avx2(auVar163);
              if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar120 >> 0x7f,0) == '\0') &&
                    (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar120 >> 0xbf,0) == '\0') &&
                  (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar120[0x1f]) goto LAB_018ab046;
              auVar120 = vcmpps_avx(ZEXT1632(auVar7),ZEXT832(0) << 0x20,4);
              auVar166 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
              auVar163 = vpand_avx(auVar163,auVar166);
              auVar120 = vpmovsxwd_avx2(auVar163);
              auVar158._8_8_ = uStack_5f8;
              auVar158._0_8_ = local_600;
              auVar158._16_8_ = uStack_5f0;
              auVar158._24_8_ = uStack_5e8;
              if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar120 >> 0x7f,0) != '\0') ||
                    (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar120 >> 0xbf,0) != '\0') ||
                  (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar120[0x1f] < '\0') {
                auVar127 = ZEXT1632(CONCAT412(fVar113 * auVar5._12_4_,
                                              CONCAT48(fVar112 * auVar5._8_4_,
                                                       CONCAT44(fVar111 * auVar5._4_4_,
                                                                fVar135 * auVar5._0_4_))));
                auVar82._28_4_ = SUB84(uStack_5e8,4);
                auVar82._0_28_ =
                     ZEXT1628(CONCAT412(fVar113 * auVar6._12_4_,
                                        CONCAT48(fVar112 * auVar6._8_4_,
                                                 CONCAT44(fVar111 * auVar6._4_4_,
                                                          fVar135 * auVar6._0_4_))));
                auVar193._8_4_ = 0x3f800000;
                auVar193._0_8_ = 0x3f8000003f800000;
                auVar193._12_4_ = 0x3f800000;
                auVar193._16_4_ = 0x3f800000;
                auVar193._20_4_ = 0x3f800000;
                auVar193._24_4_ = 0x3f800000;
                auVar193._28_4_ = 0x3f800000;
                auVar194 = ZEXT3264(auVar193);
                auVar181 = vsubps_avx(auVar193,auVar127);
                local_120 = vblendvps_avx(auVar181,auVar127,auVar100);
                auVar181 = vsubps_avx(auVar193,auVar82);
                local_440 = vblendvps_avx(auVar181,auVar82,auVar100);
                auVar158 = auVar120;
                local_5e0 = auVar106;
              }
            }
            auVar203 = ZEXT3264(local_7e0);
            auVar226 = ZEXT3264(local_720);
            if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar158 >> 0x7f,0) != '\0') ||
                  (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar158 >> 0xbf,0) != '\0') ||
                (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar158[0x1f] < '\0') {
              auVar120 = vsubps_avx(local_3c0,auVar155);
              auVar163 = vfmadd213ps_fma(auVar120,local_120,auVar155);
              fVar135 = *(float *)((long)local_808->ray_space + k * 4 + -0x10);
              auVar83._4_4_ = (auVar163._4_4_ + auVar163._4_4_) * fVar135;
              auVar83._0_4_ = (auVar163._0_4_ + auVar163._0_4_) * fVar135;
              auVar83._8_4_ = (auVar163._8_4_ + auVar163._8_4_) * fVar135;
              auVar83._12_4_ = (auVar163._12_4_ + auVar163._12_4_) * fVar135;
              auVar83._16_4_ = fVar135 * 0.0;
              auVar83._20_4_ = fVar135 * 0.0;
              auVar83._24_4_ = fVar135 * 0.0;
              auVar83._28_4_ = fVar135;
              auVar120 = vcmpps_avx(local_5e0,auVar83,6);
              auVar181 = auVar158 & auVar120;
              if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar181 >> 0x7f,0) != '\0') ||
                    (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar181 >> 0xbf,0) != '\0') ||
                  (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar181[0x1f] < '\0') {
                auVar130._8_4_ = 0xbf800000;
                auVar130._0_8_ = 0xbf800000bf800000;
                auVar130._12_4_ = 0xbf800000;
                auVar130._16_4_ = 0xbf800000;
                auVar130._20_4_ = 0xbf800000;
                auVar130._24_4_ = 0xbf800000;
                auVar130._28_4_ = 0xbf800000;
                auVar152._8_4_ = 0x40000000;
                auVar152._0_8_ = 0x4000000040000000;
                auVar152._12_4_ = 0x40000000;
                auVar152._16_4_ = 0x40000000;
                auVar152._20_4_ = 0x40000000;
                auVar152._24_4_ = 0x40000000;
                auVar152._28_4_ = 0x40000000;
                auVar163 = vfmadd213ps_fma(local_440,auVar152,auVar130);
                auVar179 = ZEXT1664(auVar163);
                local_2e0 = local_120;
                local_440 = ZEXT1632(auVar163);
                auVar181 = local_440;
                local_2c0 = ZEXT1632(auVar163);
                local_2a0 = local_5e0;
                local_27c = iVar15;
                local_270 = local_830;
                uStack_268 = uStack_828;
                local_260 = local_840;
                uStack_258 = uStack_838;
                local_250 = local_850;
                uStack_248 = uStack_848;
                local_240 = local_860;
                uStack_238 = uStack_858;
                pGVar17 = (context->scene->geometries).items[uVar13].ptr;
                local_440 = auVar181;
                if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_640 = vandps_avx(auVar120,auVar158);
                  fVar135 = (float)local_280;
                  local_200[0] = (fVar135 + local_120._0_4_ + 0.0) * local_160;
                  local_200[1] = (fVar135 + local_120._4_4_ + 1.0) * fStack_15c;
                  local_200[2] = (fVar135 + local_120._8_4_ + 2.0) * fStack_158;
                  local_200[3] = (fVar135 + local_120._12_4_ + 3.0) * fStack_154;
                  fStack_1f0 = (fVar135 + local_120._16_4_ + 4.0) * fStack_150;
                  fStack_1ec = (fVar135 + local_120._20_4_ + 5.0) * fStack_14c;
                  fStack_1e8 = (fVar135 + local_120._24_4_ + 6.0) * fStack_148;
                  fStack_1e4 = fVar135 + local_120._28_4_ + 7.0;
                  local_440._0_8_ = auVar163._0_8_;
                  local_440._8_8_ = auVar163._8_8_;
                  local_1e0 = local_440._0_8_;
                  uStack_1d8 = local_440._8_8_;
                  uStack_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1c0 = local_5e0;
                  auVar131._8_4_ = 0x7f800000;
                  auVar131._0_8_ = 0x7f8000007f800000;
                  auVar131._12_4_ = 0x7f800000;
                  auVar131._16_4_ = 0x7f800000;
                  auVar131._20_4_ = 0x7f800000;
                  auVar131._24_4_ = 0x7f800000;
                  auVar131._28_4_ = 0x7f800000;
                  auVar120 = vblendvps_avx(auVar131,local_5e0,local_640);
                  auVar181 = vshufps_avx(auVar120,auVar120,0xb1);
                  auVar181 = vminps_avx(auVar120,auVar181);
                  auVar106 = vshufpd_avx(auVar181,auVar181,5);
                  auVar181 = vminps_avx(auVar181,auVar106);
                  auVar106 = vpermpd_avx2(auVar181,0x4e);
                  auVar181 = vminps_avx(auVar181,auVar106);
                  auVar181 = vcmpps_avx(auVar120,auVar181,0);
                  auVar106 = local_640 & auVar181;
                  auVar120 = local_640;
                  if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar106 >> 0x7f,0) != '\0') ||
                        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar106 >> 0xbf,0) != '\0') ||
                      (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar106[0x1f] < '\0') {
                    auVar120 = vandps_avx(auVar181,local_640);
                  }
                  uVar90 = vmovmskps_avx(auVar120);
                  uVar92 = 0;
                  for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                    uVar92 = uVar92 + 1;
                  }
                  uVar91 = (ulong)uVar92;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar135 = local_200[uVar91];
                    uVar96 = *(undefined4 *)((long)&local_1e0 + uVar91 * 4);
                    fVar111 = 1.0 - fVar135;
                    auVar163 = ZEXT416((uint)(fVar135 * fVar111 * 4.0));
                    auVar166 = vfnmsub213ss_fma(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),
                                                auVar163);
                    auVar163 = vfmadd213ss_fma(ZEXT416((uint)fVar111),ZEXT416((uint)fVar111),
                                               auVar163);
                    fVar111 = fVar111 * -fVar111 * 0.5;
                    fVar112 = auVar166._0_4_ * 0.5;
                    auVar179 = ZEXT464((uint)fVar112);
                    fVar113 = auVar163._0_4_ * 0.5;
                    fVar114 = fVar135 * fVar135 * 0.5;
                    auVar164._0_4_ = fVar114 * fVar22;
                    auVar164._4_4_ = fVar114 * fVar216;
                    auVar164._8_4_ = fVar114 * fVar218;
                    auVar164._12_4_ = fVar114 * fVar219;
                    auVar141._4_4_ = fVar113;
                    auVar141._0_4_ = fVar113;
                    auVar141._8_4_ = fVar113;
                    auVar141._12_4_ = fVar113;
                    auVar163 = vfmadd132ps_fma(auVar141,auVar164,auVar10);
                    auVar165._4_4_ = fVar112;
                    auVar165._0_4_ = fVar112;
                    auVar165._8_4_ = fVar112;
                    auVar165._12_4_ = fVar112;
                    auVar163 = vfmadd132ps_fma(auVar165,auVar163,auVar9);
                    auVar142._4_4_ = fVar111;
                    auVar142._0_4_ = fVar111;
                    auVar142._8_4_ = fVar111;
                    auVar142._12_4_ = fVar111;
                    auVar163 = vfmadd132ps_fma(auVar142,auVar163,auVar8);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar91 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar163._0_4_;
                    uVar16 = vextractps_avx(auVar163,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                    uVar16 = vextractps_avx(auVar163,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                    *(float *)(ray + k * 4 + 0xf0) = fVar135;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar96;
                    *(uint *)(ray + k * 4 + 0x110) = uVar14;
                    *(uint *)(ray + k * 4 + 0x120) = uVar13;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auVar163 = *local_748;
                    local_800 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                    while( true ) {
                      fVar135 = local_200[uVar91];
                      local_4a0._4_4_ = fVar135;
                      local_4a0._0_4_ = fVar135;
                      local_4a0._8_4_ = fVar135;
                      local_4a0._12_4_ = fVar135;
                      local_490 = *(undefined4 *)((long)&local_1e0 + uVar91 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar91 * 4);
                      fVar112 = 1.0 - fVar135;
                      auVar166 = ZEXT416((uint)(fVar135 * fVar112 * 4.0));
                      auVar6 = vfnmsub213ss_fma(local_4a0,local_4a0,auVar166);
                      auVar179 = ZEXT1664(auVar6);
                      auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),
                                                 auVar166);
                      fVar111 = auVar166._0_4_ * 0.5;
                      fVar135 = fVar135 * fVar135 * 0.5;
                      auVar167._0_4_ = fVar135 * fVar22;
                      auVar167._4_4_ = fVar135 * fVar216;
                      auVar167._8_4_ = fVar135 * fVar218;
                      auVar167._12_4_ = fVar135 * fVar219;
                      auVar143._4_4_ = fVar111;
                      auVar143._0_4_ = fVar111;
                      auVar143._8_4_ = fVar111;
                      auVar143._12_4_ = fVar111;
                      auVar166 = vfmadd132ps_fma(auVar143,auVar167,auVar10);
                      fVar135 = auVar6._0_4_ * 0.5;
                      auVar168._4_4_ = fVar135;
                      auVar168._0_4_ = fVar135;
                      auVar168._8_4_ = fVar135;
                      auVar168._12_4_ = fVar135;
                      auVar166 = vfmadd132ps_fma(auVar168,auVar166,auVar9);
                      local_7b0.context = context->user;
                      fVar135 = fVar112 * -fVar112 * 0.5;
                      auVar144._4_4_ = fVar135;
                      auVar144._0_4_ = fVar135;
                      auVar144._8_4_ = fVar135;
                      auVar144._12_4_ = fVar135;
                      auVar5 = vfmadd132ps_fma(auVar144,auVar166,auVar8);
                      uVar96 = auVar5._0_4_;
                      local_4d0[0] = (RTCHitN)(char)uVar96;
                      local_4d0[1] = (RTCHitN)(char)((uint)uVar96 >> 8);
                      local_4d0[2] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                      local_4d0[3] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                      local_4d0[4] = (RTCHitN)(char)uVar96;
                      local_4d0[5] = (RTCHitN)(char)((uint)uVar96 >> 8);
                      local_4d0[6] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                      local_4d0[7] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                      local_4d0[8] = (RTCHitN)(char)uVar96;
                      local_4d0[9] = (RTCHitN)(char)((uint)uVar96 >> 8);
                      local_4d0[10] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                      local_4d0[0xb] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                      local_4d0[0xc] = (RTCHitN)(char)uVar96;
                      local_4d0[0xd] = (RTCHitN)(char)((uint)uVar96 >> 8);
                      local_4d0[0xe] = (RTCHitN)(char)((uint)uVar96 >> 0x10);
                      local_4d0[0xf] = (RTCHitN)(char)((uint)uVar96 >> 0x18);
                      auVar166 = vshufps_avx(auVar5,auVar5,0x55);
                      local_4c0 = auVar166;
                      local_4b0 = vshufps_avx(auVar5,auVar5,0xaa);
                      uStack_48c = local_490;
                      uStack_488 = local_490;
                      uStack_484 = local_490;
                      local_480 = CONCAT44(uStack_30c,local_310);
                      uStack_478 = CONCAT44(uStack_304,uStack_308);
                      local_470._4_4_ = uStack_2fc;
                      local_470._0_4_ = local_300;
                      local_470._8_4_ = uStack_2f8;
                      local_470._12_4_ = uStack_2f4;
                      vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                      uStack_45c = (local_7b0.context)->instID[0];
                      local_460 = uStack_45c;
                      uStack_458 = uStack_45c;
                      uStack_454 = uStack_45c;
                      uStack_450 = (local_7b0.context)->instPrimID[0];
                      uStack_44c = uStack_450;
                      uStack_448 = uStack_450;
                      uStack_444 = uStack_450;
                      local_7b0.valid = (int *)local_820;
                      local_7b0.geometryUserPtr = pGVar17->userPtr;
                      local_7b0.hit = local_4d0;
                      local_7b0.N = 4;
                      local_820 = auVar163;
                      local_7b0.ray = (RTCRayN *)ray;
                      if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar179 = ZEXT1664(auVar6);
                        auVar194 = ZEXT1664(auVar194._0_16_);
                        (*pGVar17->intersectionFilterN)(&local_7b0);
                      }
                      if (local_820 == (undefined1  [16])0x0) {
                        auVar166 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar166 = auVar166 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar179 = ZEXT1664(auVar179._0_16_);
                          auVar194 = ZEXT1664(auVar194._0_16_);
                          (*p_Var20)(&local_7b0);
                        }
                        auVar5 = vpcmpeqd_avx(local_820,_DAT_01f7aa10);
                        auVar6 = vpcmpeqd_avx(auVar166,auVar166);
                        auVar166 = auVar5 ^ auVar6;
                        if (local_820 != (undefined1  [16])0x0) {
                          auVar5 = auVar5 ^ auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])local_7b0.hit);
                          *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar6;
                          auVar6 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar6;
                          auVar5 = vmaskmovps_avx(auVar5,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar5;
                        }
                      }
                      auVar181 = local_5e0;
                      auVar120 = local_800;
                      auVar118._8_8_ = 0x100000001;
                      auVar118._0_8_ = 0x100000001;
                      if ((auVar118 & auVar166) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_800._0_4_;
                      }
                      else {
                        local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_800._4_4_ = 0;
                        local_800._8_4_ = 0;
                        local_800._12_4_ = 0;
                      }
                      *(undefined4 *)(local_640 + uVar91 * 4) = 0;
                      local_800._16_16_ = auVar120._16_16_;
                      auVar109._4_4_ = local_800._0_4_;
                      auVar109._0_4_ = local_800._0_4_;
                      auVar109._8_4_ = local_800._0_4_;
                      auVar109._12_4_ = local_800._0_4_;
                      auVar109._16_4_ = local_800._0_4_;
                      auVar109._20_4_ = local_800._0_4_;
                      auVar109._24_4_ = local_800._0_4_;
                      auVar109._28_4_ = local_800._0_4_;
                      auVar106 = vcmpps_avx(auVar181,auVar109,2);
                      auVar120 = vandps_avx(auVar106,local_640);
                      local_640 = local_640 & auVar106;
                      if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_640 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_640 >> 0x7f,0) == '\0') &&
                            (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_640 >> 0xbf,0) == '\0') &&
                          (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_640[0x1f]) break;
                      auVar132._8_4_ = 0x7f800000;
                      auVar132._0_8_ = 0x7f8000007f800000;
                      auVar132._12_4_ = 0x7f800000;
                      auVar132._16_4_ = 0x7f800000;
                      auVar132._20_4_ = 0x7f800000;
                      auVar132._24_4_ = 0x7f800000;
                      auVar132._28_4_ = 0x7f800000;
                      auVar181 = vblendvps_avx(auVar132,auVar181,auVar120);
                      auVar106 = vshufps_avx(auVar181,auVar181,0xb1);
                      auVar106 = vminps_avx(auVar181,auVar106);
                      auVar127 = vshufpd_avx(auVar106,auVar106,5);
                      auVar106 = vminps_avx(auVar106,auVar127);
                      auVar127 = vpermpd_avx2(auVar106,0x4e);
                      auVar106 = vminps_avx(auVar106,auVar127);
                      auVar106 = vcmpps_avx(auVar181,auVar106,0);
                      auVar127 = auVar120 & auVar106;
                      auVar181 = auVar120;
                      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar127 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar127 >> 0x7f,0) != '\0') ||
                            (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar127 >> 0xbf,0) != '\0') ||
                          (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar127[0x1f] < '\0') {
                        auVar181 = vandps_avx(auVar106,auVar120);
                      }
                      uVar90 = vmovmskps_avx(auVar181);
                      uVar92 = 0;
                      for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                        uVar92 = uVar92 + 1;
                      }
                      uVar91 = (ulong)uVar92;
                      local_640 = auVar120;
                    }
                    auVar226 = ZEXT3264(local_720);
                    auVar203 = ZEXT3264(local_7e0);
                  }
                }
              }
            }
          }
          auVar134 = ZEXT3264(local_740);
          lVar94 = lVar94 + 8;
          auVar159 = ZEXT3264(local_660);
          auVar225 = auVar226;
        } while ((int)lVar94 < iVar15);
      }
      uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar107._4_4_ = uVar96;
      auVar107._0_4_ = uVar96;
      auVar107._8_4_ = uVar96;
      auVar107._12_4_ = uVar96;
      auVar107._16_4_ = uVar96;
      auVar107._20_4_ = uVar96;
      auVar107._24_4_ = uVar96;
      auVar107._28_4_ = uVar96;
      auVar120 = vcmpps_avx(local_80,auVar107,2);
      uVar92 = vmovmskps_avx(auVar120);
      uVar89 = uVar89 & uVar89 + 0xff & uVar92;
    } while (uVar89 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }